

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O1

void aom_highbd_lpf_vertical_14_dual_sse2
               (uint16_t *s,int pitch,uint8_t *blimit0,uint8_t *limit0,uint8_t *thresh0,
               uint8_t *blimit1,uint8_t *limit1,uint8_t *thresh1,int bd)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  uint16_t uVar52;
  uint16_t uVar53;
  uint16_t uVar54;
  uint16_t uVar55;
  uint16_t uVar56;
  uint16_t uVar57;
  uint16_t uVar58;
  uint16_t uVar59;
  uint16_t uVar60;
  uint16_t uVar61;
  uint16_t uVar62;
  uint16_t uVar63;
  uint16_t uVar64;
  uint16_t uVar65;
  uint16_t uVar66;
  uint16_t uVar67;
  uint16_t uVar68;
  uint16_t uVar69;
  uint16_t uVar70;
  uint16_t uVar71;
  uint16_t uVar72;
  uint16_t uVar73;
  uint16_t uVar74;
  uint16_t uVar75;
  uint16_t uVar76;
  uint16_t uVar77;
  uint16_t uVar78;
  uint16_t uVar79;
  uint16_t uVar80;
  uint16_t uVar81;
  uint16_t uVar82;
  uint16_t uVar83;
  uint16_t uVar84;
  uint16_t uVar85;
  uint16_t uVar86;
  uint16_t uVar87;
  uint16_t uVar88;
  uint16_t uVar89;
  uint16_t uVar90;
  uint16_t uVar91;
  uint16_t uVar92;
  uint16_t uVar93;
  uint16_t uVar94;
  uint16_t uVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [12];
  undefined1 auVar98 [16];
  undefined1 auVar99 [12];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [12];
  undefined1 auVar103 [12];
  undefined1 auVar104 [12];
  undefined1 auVar105 [12];
  undefined1 auVar106 [12];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [12];
  undefined1 auVar114 [12];
  undefined1 auVar115 [12];
  undefined1 auVar116 [12];
  undefined1 auVar117 [12];
  undefined1 auVar118 [12];
  undefined1 auVar119 [12];
  undefined1 auVar120 [12];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  undefined1 auVar128 [15];
  undefined1 auVar129 [15];
  undefined1 auVar130 [15];
  undefined1 auVar131 [15];
  undefined1 auVar132 [15];
  undefined1 auVar133 [16];
  undefined1 auVar134 [12];
  unkbyte10 Var135;
  long lVar136;
  long lVar137;
  long lVar138;
  long lVar139;
  long lVar140;
  long lVar141;
  long lVar142;
  short sVar143;
  undefined4 uVar144;
  undefined4 uVar145;
  short sVar157;
  undefined8 uVar146;
  short sVar159;
  short sVar162;
  undefined1 auVar147 [12];
  undefined1 auVar149 [12];
  short sVar165;
  undefined1 auVar150 [16];
  short sVar156;
  short sVar158;
  short sVar161;
  short sVar164;
  short sVar166;
  short sVar167;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  short sVar168;
  short sVar175;
  short sVar176;
  short sVar177;
  short sVar178;
  short sVar181;
  undefined1 auVar169 [12];
  short sVar184;
  undefined1 auVar170 [16];
  short sVar180;
  short sVar183;
  short sVar185;
  short sVar186;
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  short sVar187;
  short sVar197;
  short sVar199;
  undefined1 auVar188 [12];
  short sVar193;
  short sVar194;
  short sVar195;
  short sVar196;
  short sVar198;
  short sVar200;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  short sVar201;
  undefined1 auVar192 [16];
  ushort uVar202;
  undefined1 auVar203 [12];
  undefined1 auVar204 [12];
  ushort uVar211;
  ushort uVar212;
  ushort uVar213;
  ushort uVar214;
  ushort uVar216;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  ushort uVar215;
  ushort uVar217;
  undefined1 auVar208 [16];
  undefined1 auVar218 [12];
  short sVar223;
  short sVar224;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar225 [12];
  short sVar230;
  short sVar231;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar232 [12];
  undefined1 auVar233 [16];
  undefined1 auVar236 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar246 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar261 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar272 [16];
  undefined1 auVar275 [16];
  undefined1 auVar282 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar291 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar303 [12];
  short sVar314;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar311 [16];
  undefined1 auVar315 [12];
  short sVar319;
  undefined1 auVar316 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  __m128i qs [2];
  __m128i ps [2];
  __m128i flat_q [3];
  __m128i flat_p [3];
  __m128i flat2_p [6];
  undefined1 auStack_3a8 [16];
  short local_398;
  short sStack_396;
  short sStack_394;
  short sStack_392;
  short sStack_390;
  uint16_t uStack_38e;
  short sStack_38c;
  uint16_t uStack_38a;
  short local_388;
  uint16_t uStack_386;
  short sStack_384;
  uint16_t uStack_382;
  short sStack_380;
  uint16_t uStack_37e;
  short sStack_37c;
  uint16_t uStack_37a;
  undefined1 local_378 [16];
  undefined8 local_368;
  undefined8 uStack_360;
  short local_358;
  short sStack_356;
  short sStack_354;
  short sStack_352;
  short sStack_350;
  uint16_t uStack_34e;
  short sStack_34c;
  uint16_t uStack_34a;
  undefined4 local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  short local_328;
  uint16_t uStack_326;
  short sStack_324;
  uint16_t uStack_322;
  short sStack_320;
  uint16_t uStack_31e;
  short sStack_31c;
  uint16_t uStack_31a;
  short local_318;
  uint16_t uStack_316;
  short sStack_314;
  uint16_t uStack_312;
  short sStack_310;
  uint16_t uStack_30e;
  short sStack_30c;
  uint16_t uStack_30a;
  undefined1 local_308 [16];
  undefined2 local_2f8;
  undefined2 uStack_2f6;
  undefined2 uStack_2f4;
  undefined2 uStack_2f2;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined4 local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  ushort local_1f8;
  ushort uStack_1f6;
  ushort uStack_1f4;
  ushort uStack_1f2;
  ushort uStack_1f0;
  ushort uStack_1ee;
  ushort uStack_1ec;
  ushort uStack_1ea;
  ushort local_1e8;
  ushort uStack_1e6;
  ushort uStack_1e4;
  ushort uStack_1e2;
  ushort uStack_1e0;
  ushort uStack_1de;
  ushort uStack_1dc;
  ushort uStack_1da;
  undefined1 local_1d8 [16];
  ushort local_1c8;
  ushort uStack_1c6;
  ushort uStack_1c4;
  ushort uStack_1c2;
  ushort uStack_1c0;
  ushort uStack_1be;
  ushort uStack_1bc;
  ushort uStack_1ba;
  ushort local_1b8;
  ushort uStack_1b6;
  ushort uStack_1b4;
  ushort uStack_1b2;
  ushort uStack_1b0;
  ushort uStack_1ae;
  ushort uStack_1ac;
  ushort uStack_1aa;
  undefined1 local_1a8 [16];
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  ushort local_e8;
  ushort uStack_e6;
  ushort uStack_e4;
  ushort uStack_e2;
  ushort uStack_e0;
  ushort uStack_de;
  ushort uStack_dc;
  ushort uStack_da;
  ushort local_d8;
  ushort uStack_d6;
  ushort uStack_d4;
  ushort uStack_d2;
  ushort uStack_d0;
  ushort uStack_ce;
  ushort uStack_cc;
  ushort uStack_ca;
  ushort local_c8;
  ushort uStack_c6;
  ushort uStack_c4;
  ushort uStack_c2;
  ushort uStack_c0;
  ushort uStack_be;
  ushort uStack_bc;
  ushort uStack_ba;
  ushort local_b8;
  ushort uStack_b6;
  ushort uStack_b4;
  ushort uStack_b2;
  ushort uStack_b0;
  ushort uStack_ae;
  ushort uStack_ac;
  ushort uStack_aa;
  ushort local_a8;
  ushort uStack_a6;
  ushort uStack_a4;
  ushort uStack_a2;
  ushort uStack_a0;
  ushort uStack_9e;
  ushort uStack_9c;
  ushort uStack_9a;
  ushort local_98;
  ushort uStack_96;
  ushort uStack_94;
  ushort uStack_92;
  ushort uStack_90;
  ushort uStack_8e;
  ushort uStack_8c;
  ushort uStack_8a;
  ushort uStack_88;
  ushort uStack_86;
  ushort uStack_84;
  ushort uStack_82;
  __m128i p [7];
  undefined1 auVar148 [12];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  short sVar160;
  short sVar163;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  short sVar179;
  short sVar182;
  undefined1 auVar191 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar222 [16];
  undefined1 auVar229 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [16];
  short sVar238;
  short sVar239;
  undefined1 auVar244 [16];
  undefined1 auVar247 [16];
  undefined1 auVar245 [16];
  undefined1 auVar248 [16];
  short sVar257;
  short sVar258;
  short sVar259;
  short sVar260;
  undefined1 auVar262 [16];
  undefined1 auVar268 [16];
  undefined1 auVar263 [16];
  undefined1 auVar269 [16];
  short sVar270;
  short sVar271;
  undefined1 auVar273 [16];
  undefined1 auVar276 [16];
  undefined1 auVar274 [16];
  undefined1 auVar277 [16];
  short sVar278;
  short sVar279;
  short sVar280;
  short sVar281;
  undefined1 auVar288 [16];
  undefined1 auVar292 [16];
  undefined1 auVar283 [16];
  undefined1 auVar289 [16];
  undefined1 auVar293 [16];
  undefined1 auVar284 [16];
  undefined1 auVar290 [16];
  undefined1 auVar294 [16];
  short sVar295;
  short sVar296;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  short sVar312;
  short sVar313;
  short sVar317;
  short sVar318;
  
  auVar3 = *(undefined1 (*) [16])(s + -8);
  puVar1 = s + (long)pitch + -8;
  uVar52 = *puVar1;
  uVar53 = puVar1[1];
  uVar54 = puVar1[2];
  uStack_34e = puVar1[3];
  uVar55 = puVar1[4];
  uVar56 = puVar1[5];
  uStack_38e = puVar1[7];
  lVar138 = (long)(pitch * 2);
  auVar4 = *(undefined1 (*) [16])(s + lVar138 + -8);
  lVar139 = (long)(pitch * 3);
  puVar1 = s + lVar139 + -8;
  uVar57 = *puVar1;
  uVar58 = puVar1[1];
  uVar59 = puVar1[2];
  uStack_34a = puVar1[3];
  uVar60 = puVar1[4];
  uVar61 = puVar1[5];
  uStack_38a = puVar1[7];
  lVar140 = (long)(pitch * 4);
  auVar155 = *(undefined1 (*) [16])(s + lVar140 + -8);
  lVar137 = (long)(pitch * 5);
  puVar1 = s + lVar137 + -8;
  uVar62 = *puVar1;
  uVar63 = puVar1[1];
  uVar64 = puVar1[2];
  uVar65 = puVar1[4];
  uVar66 = puVar1[5];
  uStack_37e = puVar1[6];
  uStack_386 = puVar1[7];
  lVar141 = (long)(pitch * 6);
  auVar154 = *(undefined1 (*) [16])(s + lVar141 + -8);
  lVar142 = (long)(pitch * 7);
  puVar2 = s + lVar142 + -8;
  uVar67 = *puVar2;
  uVar68 = puVar2[1];
  uVar69 = puVar2[2];
  uVar70 = puVar2[4];
  uVar71 = puVar2[5];
  uStack_37a = puVar2[6];
  uStack_382 = puVar2[7];
  sStack_350 = auVar3._6_2_;
  auVar245._0_12_ = auVar3._0_12_;
  auVar245._12_2_ = sStack_350;
  auVar245._14_2_ = uStack_34e;
  auVar244._12_4_ = auVar245._12_4_;
  auVar244._0_10_ = auVar3._0_10_;
  auVar244._10_2_ = uVar54;
  sVar258 = auVar3._4_2_;
  auVar243._10_6_ = auVar244._10_6_;
  auVar243._0_8_ = auVar3._0_8_;
  auVar243._8_2_ = sVar258;
  auVar102._4_8_ = auVar243._8_8_;
  auVar102._2_2_ = uVar53;
  sVar257 = auVar3._2_2_;
  auVar102._0_2_ = sVar257;
  auVar297._0_8_ = auVar102._0_8_ << 0x20;
  sStack_34c = auVar4._6_2_;
  auVar263._0_12_ = auVar4._0_12_;
  auVar263._12_2_ = sStack_34c;
  auVar263._14_2_ = uStack_34a;
  auVar262._12_4_ = auVar263._12_4_;
  auVar262._0_10_ = auVar4._0_10_;
  auVar262._10_2_ = uVar59;
  sVar271 = auVar4._4_2_;
  auVar261._10_6_ = auVar262._10_6_;
  auVar261._0_8_ = auVar4._0_8_;
  auVar261._8_2_ = sVar271;
  auVar103._4_8_ = auVar261._8_8_;
  auVar103._2_2_ = uVar58;
  sVar270 = auVar4._2_2_;
  auVar103._0_2_ = sVar270;
  uVar145 = CONCAT22(uVar57,auVar4._0_2_);
  auVar274._0_12_ = auVar155._0_12_;
  auVar274._12_2_ = auVar155._6_2_;
  auVar274._14_2_ = puVar1[3];
  auVar273._12_4_ = auVar274._12_4_;
  auVar273._0_10_ = auVar155._0_10_;
  auVar273._10_2_ = uVar64;
  sVar279 = auVar155._4_2_;
  auVar272._10_6_ = auVar273._10_6_;
  auVar272._0_8_ = auVar155._0_8_;
  auVar272._8_2_ = sVar279;
  auVar104._4_8_ = auVar272._8_8_;
  auVar104._2_2_ = uVar63;
  sVar278 = auVar155._2_2_;
  auVar104._0_2_ = sVar278;
  auVar304._0_8_ = auVar104._0_8_ << 0x20;
  auVar284._0_12_ = auVar154._0_12_;
  auVar284._12_2_ = auVar154._6_2_;
  auVar284._14_2_ = puVar2[3];
  auVar283._12_4_ = auVar284._12_4_;
  auVar283._0_10_ = auVar154._0_10_;
  auVar283._10_2_ = uVar69;
  sVar296 = auVar154._4_2_;
  auVar282._10_6_ = auVar283._10_6_;
  auVar282._0_8_ = auVar154._0_8_;
  auVar282._8_2_ = sVar296;
  auVar105._4_8_ = auVar282._8_8_;
  auVar105._2_2_ = uVar68;
  sVar295 = auVar154._2_2_;
  auVar105._0_2_ = sVar295;
  auVar297._8_4_ = auVar102._0_4_;
  auVar297._12_4_ = auVar103._0_4_;
  auVar304._8_4_ = auVar104._0_4_;
  auVar304._12_4_ = auVar105._0_4_;
  local_338 = auVar297._8_8_;
  uStack_330 = auVar304._8_8_;
  uStack_340 = auVar272._8_4_;
  uStack_33c = auVar282._8_4_;
  local_348 = auVar273._12_4_;
  uStack_344 = auVar283._12_4_;
  sVar159 = auVar3._8_2_;
  sVar162 = auVar3._10_2_;
  uVar146 = CONCAT26(uVar56,CONCAT24(sVar162,CONCAT22(uVar55,sVar159)));
  sStack_390 = auVar3._14_2_;
  sVar178 = auVar4._8_2_;
  sVar181 = auVar4._10_2_;
  sStack_38c = auVar4._14_2_;
  sVar196 = auVar155._8_2_;
  sVar198 = auVar155._10_2_;
  auVar207._0_8_ = CONCAT26(uVar66,CONCAT24(sVar198,CONCAT22(uVar65,sVar196)));
  sStack_380 = auVar155._12_2_;
  auVar207._8_2_ = sStack_380;
  auVar207._10_2_ = uStack_37e;
  local_388 = auVar155._14_2_;
  auVar207._12_2_ = local_388;
  auVar207._14_2_ = uStack_386;
  sVar223 = auVar154._8_2_;
  sVar224 = auVar154._10_2_;
  sStack_37c = auVar154._12_2_;
  sStack_384 = auVar154._14_2_;
  auVar226._8_4_ = (int)((ulong)uVar146 >> 0x20);
  auVar226._0_8_ = uVar146;
  auVar226._12_4_ = (int)(CONCAT26(uVar61,CONCAT24(sVar181,CONCAT22(uVar60,sVar178))) >> 0x20);
  auVar205._8_4_ = (int)((ulong)auVar207._0_8_ >> 0x20);
  auVar205._0_8_ = auVar207._0_8_;
  auVar205._12_4_ = (int)(CONCAT26(uVar71,CONCAT24(sVar224,CONCAT22(uVar70,sVar223))) >> 0x20);
  local_368 = CONCAT44(CONCAT22(uVar60,sVar178),CONCAT22(uVar55,sVar159));
  uStack_360 = CONCAT44(CONCAT22(uVar70,sVar223),CONCAT22(uVar65,sVar196));
  local_378._8_8_ = auVar205._8_8_;
  local_378._0_8_ = auVar226._8_8_;
  auVar205 = *(undefined1 (*) [16])s;
  puVar1 = s + pitch;
  uStack_326 = *puVar1;
  uStack_316 = puVar1[1];
  uVar72 = puVar1[2];
  uVar73 = puVar1[3];
  uVar74 = puVar1[4];
  uVar75 = puVar1[5];
  uVar76 = puVar1[6];
  uVar77 = puVar1[7];
  auVar226 = *(undefined1 (*) [16])(s + lVar138);
  puVar1 = s + lVar139;
  uStack_322 = *puVar1;
  uStack_312 = puVar1[1];
  uVar78 = puVar1[2];
  uVar79 = puVar1[3];
  uVar80 = puVar1[4];
  uVar81 = puVar1[5];
  uVar82 = puVar1[6];
  uVar83 = puVar1[7];
  auVar245 = *(undefined1 (*) [16])(s + lVar140);
  puVar1 = s + lVar137;
  uStack_31e = *puVar1;
  uStack_30e = puVar1[1];
  uVar84 = puVar1[2];
  uVar85 = puVar1[3];
  uVar86 = puVar1[4];
  uVar87 = puVar1[5];
  uVar88 = puVar1[6];
  uVar89 = puVar1[7];
  auVar244 = *(undefined1 (*) [16])(s + lVar141);
  sVar281 = auVar205._6_2_;
  auVar277._0_12_ = auVar205._0_12_;
  auVar277._12_2_ = sVar281;
  auVar277._14_2_ = uVar73;
  auVar276._12_4_ = auVar277._12_4_;
  auVar276._0_10_ = auVar205._0_10_;
  auVar276._10_2_ = uVar72;
  sVar280 = auVar205._4_2_;
  auVar275._10_6_ = auVar276._10_6_;
  auVar275._0_8_ = auVar205._0_8_;
  auVar275._8_2_ = sVar280;
  auVar106._4_8_ = auVar275._8_8_;
  auVar106._2_2_ = uStack_316;
  local_318 = auVar205._2_2_;
  auVar106._0_2_ = local_318;
  local_328 = auVar205._0_2_;
  auVar266._2_2_ = uStack_326;
  auVar266._0_2_ = local_328;
  sVar231 = auVar226._6_2_;
  auVar305._0_12_ = auVar226._0_12_;
  auVar305._12_2_ = sVar231;
  auVar305._14_2_ = uVar79;
  auVar265._12_4_ = auVar305._12_4_;
  auVar265._0_10_ = auVar226._0_10_;
  auVar265._10_2_ = uVar78;
  sVar230 = auVar226._4_2_;
  auVar249._10_6_ = auVar265._10_6_;
  auVar249._0_8_ = auVar226._0_8_;
  auVar249._8_2_ = sVar230;
  sStack_314 = auVar226._2_2_;
  sStack_324 = auVar226._0_2_;
  sVar239 = auVar245._6_2_;
  auVar235._0_12_ = auVar245._0_12_;
  auVar235._12_2_ = sVar239;
  auVar235._14_2_ = uVar85;
  auVar234._12_4_ = auVar235._12_4_;
  auVar234._0_10_ = auVar245._0_10_;
  auVar234._10_2_ = uVar84;
  sVar238 = auVar245._4_2_;
  auVar233._10_6_ = auVar234._10_6_;
  auVar233._0_8_ = auVar245._0_8_;
  auVar233._8_2_ = sVar238;
  sStack_310 = auVar245._2_2_;
  sStack_320 = auVar245._0_2_;
  puVar1 = s + lVar142;
  uStack_31a = *puVar1;
  uStack_30a = puVar1[1];
  uVar90 = puVar1[2];
  uVar91 = puVar1[3];
  uVar92 = puVar1[4];
  uVar93 = puVar1[5];
  uVar94 = puVar1[6];
  uVar95 = puVar1[7];
  sVar260 = auVar244._6_2_;
  auVar248._0_12_ = auVar244._0_12_;
  auVar248._12_2_ = sVar260;
  auVar248._14_2_ = uVar91;
  auVar247._12_4_ = auVar248._12_4_;
  auVar247._0_10_ = auVar244._0_10_;
  auVar247._10_2_ = uVar90;
  sVar259 = auVar244._4_2_;
  auVar246._10_6_ = auVar247._10_6_;
  auVar246._0_8_ = auVar244._0_8_;
  auVar246._8_2_ = sVar259;
  sStack_30c = auVar244._2_2_;
  sStack_31c = auVar244._0_2_;
  local_308._4_4_ = auVar249._8_4_;
  local_308._0_4_ = auVar275._8_4_;
  local_308._8_4_ = auVar233._8_4_;
  local_308._12_4_ = auVar246._8_4_;
  uStack_2f0 = auVar276._12_4_;
  uStack_2ec = auVar265._12_4_;
  sVar317 = auVar205._8_2_;
  local_2e8 = CONCAT22(uVar74,sVar317);
  sVar318 = auVar205._10_2_;
  auVar315._0_8_ = CONCAT26(uVar75,CONCAT24(sVar318,local_2e8));
  sVar319 = auVar205._12_2_;
  auVar315._8_2_ = sVar319;
  auVar315._10_2_ = uVar76;
  sVar160 = auVar226._8_2_;
  uStack_2e4 = CONCAT22(uVar80,sVar160);
  sVar163 = auVar226._10_2_;
  auVar147._0_8_ = CONCAT26(uVar81,CONCAT24(sVar163,uStack_2e4));
  sVar165 = auVar226._12_2_;
  auVar147._8_2_ = sVar165;
  auVar147._10_2_ = uVar82;
  sVar312 = auVar245._8_2_;
  sVar313 = auVar245._10_2_;
  auVar303._0_8_ = CONCAT26(uVar87,CONCAT24(sVar313,CONCAT22(uVar86,sVar312)));
  sVar314 = auVar245._12_2_;
  auVar303._8_2_ = sVar314;
  auVar303._10_2_ = uVar88;
  sVar179 = auVar244._8_2_;
  sVar182 = auVar244._10_2_;
  auVar169._0_8_ = CONCAT26(uVar93,CONCAT24(sVar182,CONCAT22(uVar92,sVar179)));
  sVar184 = auVar244._12_2_;
  auVar169._8_2_ = sVar184;
  auVar169._10_2_ = uVar94;
  auVar227._8_4_ = (int)((ulong)auVar315._0_8_ >> 0x20);
  auVar227._0_8_ = auVar315._0_8_;
  auVar227._12_4_ = (int)((ulong)auVar147._0_8_ >> 0x20);
  auVar206._8_4_ = (int)((ulong)auVar303._0_8_ >> 0x20);
  auVar206._0_8_ = auVar303._0_8_;
  auVar206._12_4_ = (int)((ulong)auVar169._0_8_ >> 0x20);
  uStack_2e0 = CONCAT44(CONCAT22(uVar92,sVar179),CONCAT22(uVar86,sVar312));
  local_2d8 = auVar227._8_8_;
  uStack_2d0 = auVar206._8_8_;
  local_2c8 = auVar315._8_4_;
  uStack_2c4 = auVar147._8_4_;
  uStack_2c0 = auVar303._8_4_;
  uStack_2bc = auVar169._8_4_;
  auVar170 = *(undefined1 (*) [16])blimit0;
  auVar189 = *(undefined1 (*) [16])blimit1;
  auVar228 = *(undefined1 (*) [16])limit0;
  auVar10[0xd] = 0;
  auVar10._0_13_ = auVar170._0_13_;
  auVar10[0xe] = auVar170[7];
  auVar16[0xc] = auVar170[6];
  auVar16._0_12_ = auVar170._0_12_;
  auVar16._13_2_ = auVar10._13_2_;
  auVar22[0xb] = 0;
  auVar22._0_11_ = auVar170._0_11_;
  auVar22._12_3_ = auVar16._12_3_;
  auVar28[10] = auVar170[5];
  auVar28._0_10_ = auVar170._0_10_;
  auVar28._11_4_ = auVar22._11_4_;
  auVar34[9] = 0;
  auVar34._0_9_ = auVar170._0_9_;
  auVar34._10_5_ = auVar28._10_5_;
  auVar40[8] = auVar170[4];
  auVar40._0_8_ = auVar170._0_8_;
  auVar40._9_6_ = auVar34._9_6_;
  auVar107._7_8_ = 0;
  auVar107._0_7_ = auVar40._8_7_;
  auVar121._1_8_ = SUB158(auVar107 << 0x40,7);
  auVar121[0] = auVar170[3];
  auVar121._9_6_ = 0;
  auVar122._1_10_ = SUB1510(auVar121 << 0x30,5);
  auVar122[0] = auVar170[2];
  auVar122._11_4_ = 0;
  auVar51._3_12_ = SUB1512(auVar122 << 0x20,3);
  auVar51[2] = auVar170[1];
  auVar51[1] = 0;
  auVar51[0] = auVar170[0];
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar189._0_13_;
  auVar5[0xe] = auVar189[7];
  auVar11[0xc] = auVar189[6];
  auVar11._0_12_ = auVar189._0_12_;
  auVar11._13_2_ = auVar5._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar189._0_11_;
  auVar17._12_3_ = auVar11._12_3_;
  auVar23[10] = auVar189[5];
  auVar23._0_10_ = auVar189._0_10_;
  auVar23._11_4_ = auVar17._11_4_;
  auVar29[9] = 0;
  auVar29._0_9_ = auVar189._0_9_;
  auVar29._10_5_ = auVar23._10_5_;
  auVar35[8] = auVar189[4];
  auVar35._0_8_ = auVar189._0_8_;
  auVar35._9_6_ = auVar29._9_6_;
  auVar108._7_8_ = 0;
  auVar108._0_7_ = auVar35._8_7_;
  auVar123._1_8_ = SUB158(auVar108 << 0x40,7);
  auVar123[0] = auVar189[3];
  auVar123._9_6_ = 0;
  auVar124._1_10_ = SUB1510(auVar123 << 0x30,5);
  auVar124[0] = auVar189[2];
  auVar124._11_4_ = 0;
  auVar41[2] = auVar189[1];
  auVar41._0_2_ = auVar189._0_2_;
  auVar41._3_12_ = SUB1512(auVar124 << 0x20,3);
  auVar46._2_13_ = auVar41._2_13_;
  auVar46._0_2_ = auVar189._0_2_ & 0xff;
  auVar150._0_8_ = auVar51._0_8_;
  auVar150._8_8_ = auVar46._0_8_;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar228._0_13_;
  auVar6[0xe] = auVar228[7];
  auVar12[0xc] = auVar228[6];
  auVar12._0_12_ = auVar228._0_12_;
  auVar12._13_2_ = auVar6._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar228._0_11_;
  auVar18._12_3_ = auVar12._12_3_;
  auVar24[10] = auVar228[5];
  auVar24._0_10_ = auVar228._0_10_;
  auVar24._11_4_ = auVar18._11_4_;
  auVar30[9] = 0;
  auVar30._0_9_ = auVar228._0_9_;
  auVar30._10_5_ = auVar24._10_5_;
  auVar36[8] = auVar228[4];
  auVar36._0_8_ = auVar228._0_8_;
  auVar36._9_6_ = auVar30._9_6_;
  auVar109._7_8_ = 0;
  auVar109._0_7_ = auVar36._8_7_;
  auVar125._1_8_ = SUB158(auVar109 << 0x40,7);
  auVar125[0] = auVar228[3];
  auVar125._9_6_ = 0;
  auVar126._1_10_ = SUB1510(auVar125 << 0x30,5);
  auVar126[0] = auVar228[2];
  auVar126._11_4_ = 0;
  auVar42[2] = auVar228[1];
  auVar42._0_2_ = auVar228._0_2_;
  auVar42._3_12_ = SUB1512(auVar126 << 0x20,3);
  auVar47._2_13_ = auVar42._2_13_;
  auVar47._0_2_ = auVar228._0_2_ & 0xff;
  auVar170 = *(undefined1 (*) [16])limit1;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar170._0_13_;
  auVar7[0xe] = auVar170[7];
  auVar13[0xc] = auVar170[6];
  auVar13._0_12_ = auVar170._0_12_;
  auVar13._13_2_ = auVar7._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar170._0_11_;
  auVar19._12_3_ = auVar13._12_3_;
  auVar25[10] = auVar170[5];
  auVar25._0_10_ = auVar170._0_10_;
  auVar25._11_4_ = auVar19._11_4_;
  auVar31[9] = 0;
  auVar31._0_9_ = auVar170._0_9_;
  auVar31._10_5_ = auVar25._10_5_;
  auVar37[8] = auVar170[4];
  auVar37._0_8_ = auVar170._0_8_;
  auVar37._9_6_ = auVar31._9_6_;
  auVar110._7_8_ = 0;
  auVar110._0_7_ = auVar37._8_7_;
  auVar127._1_8_ = SUB158(auVar110 << 0x40,7);
  auVar127[0] = auVar170[3];
  auVar127._9_6_ = 0;
  auVar128._1_10_ = SUB1510(auVar127 << 0x30,5);
  auVar128[0] = auVar170[2];
  auVar128._11_4_ = 0;
  auVar43[2] = auVar170[1];
  auVar43._0_2_ = auVar170._0_2_;
  auVar43._3_12_ = SUB1512(auVar128 << 0x20,3);
  auVar48._2_13_ = auVar43._2_13_;
  auVar48._0_2_ = auVar170._0_2_ & 0xff;
  auVar264._0_8_ = auVar47._0_8_;
  auVar264._8_8_ = auVar48._0_8_;
  auVar170 = *(undefined1 (*) [16])thresh0;
  auVar8[0xd] = 0;
  auVar8._0_13_ = auVar170._0_13_;
  auVar8[0xe] = auVar170[7];
  auVar14[0xc] = auVar170[6];
  auVar14._0_12_ = auVar170._0_12_;
  auVar14._13_2_ = auVar8._13_2_;
  auVar20[0xb] = 0;
  auVar20._0_11_ = auVar170._0_11_;
  auVar20._12_3_ = auVar14._12_3_;
  auVar26[10] = auVar170[5];
  auVar26._0_10_ = auVar170._0_10_;
  auVar26._11_4_ = auVar20._11_4_;
  auVar32[9] = 0;
  auVar32._0_9_ = auVar170._0_9_;
  auVar32._10_5_ = auVar26._10_5_;
  auVar38[8] = auVar170[4];
  auVar38._0_8_ = auVar170._0_8_;
  auVar38._9_6_ = auVar32._9_6_;
  auVar111._7_8_ = 0;
  auVar111._0_7_ = auVar38._8_7_;
  auVar129._1_8_ = SUB158(auVar111 << 0x40,7);
  auVar129[0] = auVar170[3];
  auVar129._9_6_ = 0;
  auVar130._1_10_ = SUB1510(auVar129 << 0x30,5);
  auVar130[0] = auVar170[2];
  auVar130._11_4_ = 0;
  auVar44[2] = auVar170[1];
  auVar44._0_2_ = auVar170._0_2_;
  auVar44._3_12_ = SUB1512(auVar130 << 0x20,3);
  auVar49._2_13_ = auVar44._2_13_;
  auVar49._0_2_ = auVar170._0_2_ & 0xff;
  auVar170 = *(undefined1 (*) [16])thresh1;
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar170._0_13_;
  auVar9[0xe] = auVar170[7];
  auVar15[0xc] = auVar170[6];
  auVar15._0_12_ = auVar170._0_12_;
  auVar15._13_2_ = auVar9._13_2_;
  auVar21[0xb] = 0;
  auVar21._0_11_ = auVar170._0_11_;
  auVar21._12_3_ = auVar15._12_3_;
  auVar27[10] = auVar170[5];
  auVar27._0_10_ = auVar170._0_10_;
  auVar27._11_4_ = auVar21._11_4_;
  auVar33[9] = 0;
  auVar33._0_9_ = auVar170._0_9_;
  auVar33._10_5_ = auVar27._10_5_;
  auVar39[8] = auVar170[4];
  auVar39._0_8_ = auVar170._0_8_;
  auVar39._9_6_ = auVar33._9_6_;
  auVar112._7_8_ = 0;
  auVar112._0_7_ = auVar39._8_7_;
  auVar131._1_8_ = SUB158(auVar112 << 0x40,7);
  auVar131[0] = auVar170[3];
  auVar131._9_6_ = 0;
  auVar132._1_10_ = SUB1510(auVar131 << 0x30,5);
  auVar132[0] = auVar170[2];
  auVar132._11_4_ = 0;
  auVar45[2] = auVar170[1];
  auVar45._0_2_ = auVar170._0_2_;
  auVar45._3_12_ = SUB1512(auVar132 << 0x20,3);
  auVar50._2_13_ = auVar45._2_13_;
  auVar50._0_2_ = auVar170._0_2_ & 0xff;
  auVar320._0_8_ = auVar49._0_8_;
  auVar320._8_8_ = auVar50._0_8_;
  auVar170._2_2_ = sStack_396;
  auVar170._0_2_ = local_398;
  auVar170._4_2_ = sStack_394;
  auVar170._6_2_ = sStack_392;
  auVar170._8_2_ = sStack_390;
  auVar170._10_2_ = uStack_38e;
  auVar170._12_2_ = sStack_38c;
  auVar170._14_2_ = uStack_38a;
  auVar266._4_2_ = sStack_324;
  auVar266._6_2_ = uStack_322;
  auVar266._8_2_ = sStack_320;
  auVar266._10_2_ = uStack_31e;
  auVar266._12_2_ = sStack_31c;
  auVar266._14_2_ = uStack_31a;
  auVar206 = psubusw(auVar170,auVar266);
  auVar227 = psubusw(auVar266,auVar170);
  auVar189._4_2_ = sStack_384;
  auVar189._0_4_ = auVar207._12_4_;
  auVar189._6_2_ = uStack_382;
  auVar189._8_2_ = sStack_380;
  auVar189._10_2_ = uStack_37e;
  auVar189._12_2_ = sStack_37c;
  auVar189._14_2_ = uStack_37a;
  auVar228._4_2_ = sStack_314;
  auVar228._0_4_ = auVar106._0_4_;
  auVar228._6_2_ = uStack_312;
  auVar228._8_2_ = sStack_310;
  auVar228._10_2_ = uStack_30e;
  auVar228._12_2_ = sStack_30c;
  auVar228._14_2_ = uStack_30a;
  auVar207 = psubusw(auVar189,auVar228);
  auVar249 = psubusw(auVar228,auVar189);
  auVar249 = auVar249 | auVar207;
  auVar305 = ZEXT416(bd - 8);
  auVar150 = psllw(auVar150,auVar305);
  auVar265 = psllw(auVar264,auVar305);
  auVar207 = paddusw(auVar227 | auVar206,auVar227 | auVar206);
  auVar250._0_2_ = auVar249._0_2_ >> 1;
  auVar250._2_2_ = auVar249._2_2_ >> 1;
  auVar250._4_2_ = auVar249._4_2_ >> 1;
  auVar250._6_2_ = auVar249._6_2_ >> 1;
  auVar250._8_2_ = auVar249._8_2_ >> 1;
  auVar250._10_2_ = auVar249._10_2_ >> 1;
  auVar250._12_2_ = auVar249._12_2_ >> 1;
  auVar250._14_2_ = auVar249._14_2_ >> 1;
  auVar207 = paddusw(auVar250,auVar207);
  auVar207 = auVar207 ^ _DAT_004dab60;
  auVar150 = auVar150 ^ _DAT_004dab60;
  auVar251._0_2_ = -(ushort)(auVar150._0_2_ < auVar207._0_2_);
  auVar251._2_2_ = -(ushort)(auVar150._2_2_ < auVar207._2_2_);
  auVar251._4_2_ = -(ushort)(auVar150._4_2_ < auVar207._4_2_);
  auVar251._6_2_ = -(ushort)(auVar150._6_2_ < auVar207._6_2_);
  auVar251._8_2_ = -(ushort)(auVar150._8_2_ < auVar207._8_2_);
  auVar251._10_2_ = -(ushort)(auVar150._10_2_ < auVar207._10_2_);
  auVar251._12_2_ = -(ushort)(auVar150._12_2_ < auVar207._12_2_);
  auVar251._14_2_ = -(ushort)(auVar150._14_2_ < auVar207._14_2_);
  auVar285 = paddusw(_DAT_005154e0,auVar265);
  auVar285 = auVar285 & auVar251;
  lVar136 = 0x10;
  auVar150 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  do {
    auVar206 = psubusw(*(undefined1 (*) [16])((long)&local_398 + lVar136),
                       *(undefined1 (*) [16])(auStack_3a8 + lVar136));
    auVar207 = psubusw(*(undefined1 (*) [16])(auStack_3a8 + lVar136),
                       *(undefined1 (*) [16])((long)&local_398 + lVar136));
    auVar207 = auVar207 | auVar206;
    sVar143 = auVar285._0_2_;
    sVar156 = auVar207._0_2_;
    uVar202 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar285._2_2_;
    sVar156 = auVar207._2_2_;
    uVar211 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar285._4_2_;
    sVar156 = auVar207._4_2_;
    uVar212 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar285._6_2_;
    sVar156 = auVar207._6_2_;
    uVar213 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar285._8_2_;
    sVar156 = auVar207._8_2_;
    uVar214 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar285._10_2_;
    sVar156 = auVar207._10_2_;
    uVar215 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar285._12_2_;
    sVar156 = auVar207._12_2_;
    sVar157 = auVar207._14_2_;
    uVar216 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar285._14_2_;
    uVar217 = (ushort)(sVar157 < sVar143) * sVar143 | (ushort)(sVar157 >= sVar143) * sVar157;
    auVar207 = psubusw(*(undefined1 (*) [16])((long)&local_328 + lVar136),
                       *(undefined1 (*) [16])((long)&local_338 + lVar136));
    auVar206 = psubusw(*(undefined1 (*) [16])((long)&local_338 + lVar136),
                       *(undefined1 (*) [16])((long)&local_328 + lVar136));
    auVar206 = auVar206 | auVar207;
    sVar143 = auVar206._0_2_;
    auVar285._0_2_ =
         (sVar143 < (short)uVar202) * uVar202 | (ushort)(sVar143 >= (short)uVar202) * sVar143;
    sVar143 = auVar206._2_2_;
    auVar285._2_2_ =
         (sVar143 < (short)uVar211) * uVar211 | (ushort)(sVar143 >= (short)uVar211) * sVar143;
    sVar143 = auVar206._4_2_;
    auVar285._4_2_ =
         (sVar143 < (short)uVar212) * uVar212 | (ushort)(sVar143 >= (short)uVar212) * sVar143;
    sVar143 = auVar206._6_2_;
    auVar285._6_2_ =
         (sVar143 < (short)uVar213) * uVar213 | (ushort)(sVar143 >= (short)uVar213) * sVar143;
    sVar143 = auVar206._8_2_;
    auVar285._8_2_ =
         (sVar143 < (short)uVar214) * uVar214 | (ushort)(sVar143 >= (short)uVar214) * sVar143;
    sVar143 = auVar206._10_2_;
    auVar285._10_2_ =
         (sVar143 < (short)uVar215) * uVar215 | (ushort)(sVar143 >= (short)uVar215) * sVar143;
    sVar143 = auVar206._12_2_;
    sVar156 = auVar206._14_2_;
    auVar285._12_2_ =
         (sVar143 < (short)uVar216) * uVar216 | (ushort)(sVar143 >= (short)uVar216) * sVar143;
    auVar285._14_2_ =
         (sVar156 < (short)uVar217) * uVar217 | (ushort)(sVar156 >= (short)uVar217) * sVar156;
    lVar136 = lVar136 + 0x10;
  } while (lVar136 != 0x40);
  auVar150 = pshuflw(auVar150,auVar150,0);
  uVar144 = auVar150._0_4_;
  auVar208._4_4_ = uVar144;
  auVar208._0_4_ = uVar144;
  auVar208._8_4_ = uVar144;
  auVar208._12_4_ = uVar144;
  auVar150 = psubusw(auVar228,auVar266);
  auVar207 = psubusw(auVar266,auVar228);
  auVar207 = auVar207 | auVar150;
  auVar150 = psubusw(auVar189,auVar170);
  auVar206 = psubusw(auVar170,auVar189);
  auVar206 = auVar206 | auVar150;
  sVar143 = auVar207._0_2_;
  sVar156 = auVar206._0_2_;
  auVar252._0_2_ = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
  sVar143 = auVar207._2_2_;
  sVar156 = auVar206._2_2_;
  auVar252._2_2_ = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
  sVar143 = auVar207._4_2_;
  sVar156 = auVar206._4_2_;
  auVar252._4_2_ = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
  sVar143 = auVar207._6_2_;
  sVar156 = auVar206._6_2_;
  auVar252._6_2_ = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
  sVar143 = auVar207._8_2_;
  sVar156 = auVar206._8_2_;
  auVar252._8_2_ = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
  sVar143 = auVar207._10_2_;
  sVar156 = auVar206._10_2_;
  auVar252._10_2_ = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
  sVar143 = auVar207._12_2_;
  sVar156 = auVar206._12_2_;
  sVar157 = auVar206._14_2_;
  auVar252._12_2_ = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
  sVar143 = auVar207._14_2_;
  auVar252._14_2_ = (ushort)(sVar157 < sVar143) * sVar143 | (ushort)(sVar157 >= sVar143) * sVar157;
  lVar136 = 0x20;
  auVar298 = auVar252;
  do {
    auVar207 = psubusw(auVar170,*(undefined1 (*) [16])((long)&local_398 + lVar136));
    auVar150 = psubusw(*(undefined1 (*) [16])((long)&local_398 + lVar136),auVar170);
    auVar150 = auVar150 | auVar207;
    sVar143 = auVar298._0_2_;
    sVar156 = auVar150._0_2_;
    uVar202 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar298._2_2_;
    sVar156 = auVar150._2_2_;
    uVar211 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar298._4_2_;
    sVar156 = auVar150._4_2_;
    uVar212 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar298._6_2_;
    sVar156 = auVar150._6_2_;
    uVar213 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar298._8_2_;
    sVar156 = auVar150._8_2_;
    uVar214 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar298._10_2_;
    sVar156 = auVar150._10_2_;
    uVar215 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar298._12_2_;
    sVar156 = auVar150._12_2_;
    sVar157 = auVar150._14_2_;
    uVar216 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar298._14_2_;
    uVar217 = (ushort)(sVar157 < sVar143) * sVar143 | (ushort)(sVar157 >= sVar143) * sVar157;
    auVar150 = psubusw(auVar266,*(undefined1 (*) [16])((long)&local_328 + lVar136));
    auVar207 = psubusw(*(undefined1 (*) [16])((long)&local_328 + lVar136),auVar266);
    auVar207 = auVar207 | auVar150;
    sVar143 = auVar207._0_2_;
    auVar298._0_2_ =
         (sVar143 < (short)uVar202) * uVar202 | (ushort)(sVar143 >= (short)uVar202) * sVar143;
    sVar143 = auVar207._2_2_;
    auVar298._2_2_ =
         (sVar143 < (short)uVar211) * uVar211 | (ushort)(sVar143 >= (short)uVar211) * sVar143;
    sVar143 = auVar207._4_2_;
    auVar298._4_2_ =
         (sVar143 < (short)uVar212) * uVar212 | (ushort)(sVar143 >= (short)uVar212) * sVar143;
    sVar143 = auVar207._6_2_;
    auVar298._6_2_ =
         (sVar143 < (short)uVar213) * uVar213 | (ushort)(sVar143 >= (short)uVar213) * sVar143;
    sVar143 = auVar207._8_2_;
    auVar298._8_2_ =
         (sVar143 < (short)uVar214) * uVar214 | (ushort)(sVar143 >= (short)uVar214) * sVar143;
    sVar143 = auVar207._10_2_;
    auVar298._10_2_ =
         (sVar143 < (short)uVar215) * uVar215 | (ushort)(sVar143 >= (short)uVar215) * sVar143;
    sVar143 = auVar207._12_2_;
    sVar156 = auVar207._14_2_;
    auVar298._12_2_ =
         (sVar143 < (short)uVar216) * uVar216 | (ushort)(sVar143 >= (short)uVar216) * sVar143;
    auVar298._14_2_ =
         (sVar156 < (short)uVar217) * uVar217 | (ushort)(sVar156 >= (short)uVar217) * sVar156;
    lVar136 = lVar136 + 0x10;
  } while (lVar136 != 0x40);
  auVar207 = psllw(auVar320,auVar305);
  auVar150 = psllw(_DAT_005154e0,auVar305);
  auVar98._4_4_ = uStack_2e4;
  auVar98._0_4_ = local_2e8;
  auVar98._8_8_ = uStack_2e0;
  auVar206 = psubusw(auVar266,auVar98);
  auVar320 = psubusw(auVar98,auVar266);
  auVar320 = auVar320 | auVar206;
  auVar96._2_2_ = sStack_356;
  auVar96._0_2_ = local_358;
  auVar96._4_2_ = sStack_354;
  auVar96._6_2_ = sStack_352;
  auVar96._8_2_ = sStack_350;
  auVar96._10_2_ = uStack_34e;
  auVar96._12_2_ = sStack_34c;
  auVar96._14_2_ = uStack_34a;
  auVar206 = psubusw(auVar170,auVar96);
  auVar227 = psubusw(auVar96,auVar170);
  auVar227 = auVar227 | auVar206;
  sVar143 = auVar320._0_2_;
  sVar156 = auVar227._0_2_;
  auVar306._0_2_ = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
  sVar143 = auVar320._2_2_;
  sVar156 = auVar227._2_2_;
  auVar306._2_2_ = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
  sVar143 = auVar320._4_2_;
  sVar156 = auVar227._4_2_;
  auVar306._4_2_ = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
  sVar143 = auVar320._6_2_;
  sVar156 = auVar227._6_2_;
  auVar306._6_2_ = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
  sVar143 = auVar320._8_2_;
  sVar156 = auVar227._8_2_;
  auVar306._8_2_ = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
  sVar143 = auVar320._10_2_;
  sVar156 = auVar227._10_2_;
  auVar306._10_2_ = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
  sVar143 = auVar320._12_2_;
  sVar156 = auVar227._12_2_;
  sVar157 = auVar227._14_2_;
  auVar306._12_2_ = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
  sVar143 = auVar320._14_2_;
  auVar306._14_2_ = (ushort)(sVar157 < sVar143) * sVar143 | (ushort)(sVar157 >= sVar143) * sVar157;
  lVar136 = 0x50;
  do {
    auVar227 = psubusw(auVar170,*(undefined1 (*) [16])((long)&local_398 + lVar136));
    auVar206 = psubusw(*(undefined1 (*) [16])((long)&local_398 + lVar136),auVar170);
    auVar206 = auVar206 | auVar227;
    sVar143 = auVar306._0_2_;
    sVar156 = auVar206._0_2_;
    uVar202 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar306._2_2_;
    sVar156 = auVar206._2_2_;
    uVar211 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar306._4_2_;
    sVar156 = auVar206._4_2_;
    uVar212 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar306._6_2_;
    sVar156 = auVar206._6_2_;
    uVar213 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar306._8_2_;
    sVar156 = auVar206._8_2_;
    uVar214 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar306._10_2_;
    sVar156 = auVar206._10_2_;
    uVar215 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar306._12_2_;
    sVar156 = auVar206._12_2_;
    sVar157 = auVar206._14_2_;
    uVar216 = (ushort)(sVar156 < sVar143) * sVar143 | (ushort)(sVar156 >= sVar143) * sVar156;
    sVar143 = auVar306._14_2_;
    uVar217 = (ushort)(sVar157 < sVar143) * sVar143 | (ushort)(sVar157 >= sVar143) * sVar157;
    auVar227 = psubusw(auVar266,*(undefined1 (*) [16])((long)&local_328 + lVar136));
    auVar206 = psubusw(*(undefined1 (*) [16])((long)&local_328 + lVar136),auVar266);
    auVar206 = auVar206 | auVar227;
    sVar143 = auVar206._0_2_;
    auVar306._0_2_ =
         (sVar143 < (short)uVar202) * uVar202 | (ushort)(sVar143 >= (short)uVar202) * sVar143;
    sVar143 = auVar206._2_2_;
    auVar306._2_2_ =
         (sVar143 < (short)uVar211) * uVar211 | (ushort)(sVar143 >= (short)uVar211) * sVar143;
    sVar143 = auVar206._4_2_;
    auVar306._4_2_ =
         (sVar143 < (short)uVar212) * uVar212 | (ushort)(sVar143 >= (short)uVar212) * sVar143;
    sVar143 = auVar206._6_2_;
    auVar306._6_2_ =
         (sVar143 < (short)uVar213) * uVar213 | (ushort)(sVar143 >= (short)uVar213) * sVar143;
    sVar143 = auVar206._8_2_;
    auVar306._8_2_ =
         (sVar143 < (short)uVar214) * uVar214 | (ushort)(sVar143 >= (short)uVar214) * sVar143;
    sVar143 = auVar206._10_2_;
    auVar306._10_2_ =
         (sVar143 < (short)uVar215) * uVar215 | (ushort)(sVar143 >= (short)uVar215) * sVar143;
    sVar143 = auVar206._12_2_;
    sVar156 = auVar206._14_2_;
    auVar306._12_2_ =
         (sVar143 < (short)uVar216) * uVar216 | (ushort)(sVar143 >= (short)uVar216) * sVar143;
    auVar306._14_2_ =
         (sVar156 < (short)uVar217) * uVar217 | (ushort)(sVar156 >= (short)uVar217) * sVar156;
    lVar136 = lVar136 + 0x10;
  } while (lVar136 != 0x70);
  auVar206 = psubusw(auVar285,auVar265);
  auVar286._0_2_ = -(ushort)(auVar206._0_2_ == 0);
  auVar286._2_2_ = -(ushort)(auVar206._2_2_ == 0);
  auVar286._4_2_ = -(ushort)(auVar206._4_2_ == 0);
  auVar286._6_2_ = -(ushort)(auVar206._6_2_ == 0);
  auVar286._8_2_ = -(ushort)(auVar206._8_2_ == 0);
  auVar286._10_2_ = -(ushort)(auVar206._10_2_ == 0);
  auVar286._12_2_ = -(ushort)(auVar206._12_2_ == 0);
  auVar286._14_2_ = -(ushort)(auVar206._14_2_ == 0);
  auVar206 = psubusw(auVar298,auVar150);
  auVar299._0_2_ = -(ushort)(auVar206._0_2_ == 0);
  auVar299._2_2_ = -(ushort)(auVar206._2_2_ == 0);
  auVar299._4_2_ = -(ushort)(auVar206._4_2_ == 0);
  auVar299._6_2_ = -(ushort)(auVar206._6_2_ == 0);
  auVar299._8_2_ = -(ushort)(auVar206._8_2_ == 0);
  auVar299._10_2_ = -(ushort)(auVar206._10_2_ == 0);
  auVar299._12_2_ = -(ushort)(auVar206._12_2_ == 0);
  auVar299._14_2_ = -(ushort)(auVar206._14_2_ == 0);
  auVar170 = psubsw(auVar170,auVar208);
  auVar206 = psubsw(auVar189,auVar208);
  auVar189 = psubsw(auVar266,auVar208);
  auVar227 = psubsw(auVar228,auVar208);
  auVar228 = psllw(_DAT_005154e0,ZEXT416((uint)bd));
  auVar240._8_4_ = 0xffffffff;
  auVar240._0_8_ = 0xffffffffffffffff;
  auVar240._12_4_ = 0xffffffff;
  auVar228 = paddsw(auVar228,auVar240);
  auVar228 = psubsw(auVar228,auVar208);
  auVar266 = psubsw((undefined1  [16])0x0,auVar208);
  auVar320 = psubsw(auVar206,auVar227);
  sVar168 = auVar228._0_2_;
  sVar143 = auVar320._0_2_;
  uVar202 = (ushort)(sVar168 < sVar143) * sVar168 | (ushort)(sVar168 >= sVar143) * sVar143;
  sVar175 = auVar228._2_2_;
  sVar143 = auVar320._2_2_;
  uVar211 = (ushort)(sVar175 < sVar143) * sVar175 | (ushort)(sVar175 >= sVar143) * sVar143;
  sVar176 = auVar228._4_2_;
  sVar143 = auVar320._4_2_;
  uVar212 = (ushort)(sVar176 < sVar143) * sVar176 | (ushort)(sVar176 >= sVar143) * sVar143;
  sVar177 = auVar228._6_2_;
  sVar143 = auVar320._6_2_;
  uVar213 = (ushort)(sVar177 < sVar143) * sVar177 | (ushort)(sVar177 >= sVar143) * sVar143;
  sVar180 = auVar228._8_2_;
  sVar143 = auVar320._8_2_;
  uVar214 = (ushort)(sVar180 < sVar143) * sVar180 | (ushort)(sVar180 >= sVar143) * sVar143;
  sVar183 = auVar228._10_2_;
  sVar143 = auVar320._10_2_;
  uVar215 = (ushort)(sVar183 < sVar143) * sVar183 | (ushort)(sVar183 >= sVar143) * sVar143;
  sVar185 = auVar228._12_2_;
  sVar143 = auVar320._12_2_;
  sVar156 = auVar320._14_2_;
  uVar216 = (ushort)(sVar185 < sVar143) * sVar185 | (ushort)(sVar185 >= sVar143) * sVar143;
  sVar186 = auVar228._14_2_;
  uVar217 = (ushort)(sVar186 < sVar156) * sVar186 | (ushort)(sVar186 >= sVar156) * sVar156;
  sVar143 = auVar266._0_2_;
  auVar321._0_2_ =
       (ushort)((short)uVar202 < sVar143) * sVar143 | ((short)uVar202 >= sVar143) * uVar202;
  sVar156 = auVar266._2_2_;
  auVar321._2_2_ =
       (ushort)((short)uVar211 < sVar156) * sVar156 | ((short)uVar211 >= sVar156) * uVar211;
  sVar157 = auVar266._4_2_;
  auVar321._4_2_ =
       (ushort)((short)uVar212 < sVar157) * sVar157 | ((short)uVar212 >= sVar157) * uVar212;
  sVar158 = auVar266._6_2_;
  auVar321._6_2_ =
       (ushort)((short)uVar213 < sVar158) * sVar158 | ((short)uVar213 >= sVar158) * uVar213;
  sVar161 = auVar266._8_2_;
  auVar321._8_2_ =
       (ushort)((short)uVar214 < sVar161) * sVar161 | ((short)uVar214 >= sVar161) * uVar214;
  sVar164 = auVar266._10_2_;
  auVar321._10_2_ =
       (ushort)((short)uVar215 < sVar164) * sVar164 | ((short)uVar215 >= sVar164) * uVar215;
  sVar166 = auVar266._12_2_;
  auVar321._12_2_ =
       (ushort)((short)uVar216 < sVar166) * sVar166 | ((short)uVar216 >= sVar166) * uVar216;
  sVar167 = auVar266._14_2_;
  auVar321._14_2_ =
       (ushort)((short)uVar217 < sVar167) * sVar167 | ((short)uVar217 >= sVar167) * uVar217;
  auVar207 = auVar207 ^ _DAT_004dab60;
  auVar252 = auVar252 ^ _DAT_004dab60;
  auVar253._0_2_ = -(ushort)(auVar207._0_2_ < auVar252._0_2_);
  auVar253._2_2_ = -(ushort)(auVar207._2_2_ < auVar252._2_2_);
  auVar253._4_2_ = -(ushort)(auVar207._4_2_ < auVar252._4_2_);
  auVar253._6_2_ = -(ushort)(auVar207._6_2_ < auVar252._6_2_);
  auVar253._8_2_ = -(ushort)(auVar207._8_2_ < auVar252._8_2_);
  auVar253._10_2_ = -(ushort)(auVar207._10_2_ < auVar252._10_2_);
  auVar253._12_2_ = -(ushort)(auVar207._12_2_ < auVar252._12_2_);
  auVar253._14_2_ = -(ushort)(auVar207._14_2_ < auVar252._14_2_);
  auVar228 = psubsw(auVar189,auVar170);
  auVar266 = paddsw(auVar321 & auVar253,auVar228);
  auVar266 = paddsw(auVar266,auVar228);
  auVar228 = paddsw(auVar266,auVar228);
  sVar187 = auVar228._0_2_;
  uVar202 = (ushort)(sVar168 < sVar187) * sVar168 | (ushort)(sVar168 >= sVar187) * sVar187;
  sVar187 = auVar228._2_2_;
  uVar211 = (ushort)(sVar175 < sVar187) * sVar175 | (ushort)(sVar175 >= sVar187) * sVar187;
  sVar187 = auVar228._4_2_;
  uVar212 = (ushort)(sVar176 < sVar187) * sVar176 | (ushort)(sVar176 >= sVar187) * sVar187;
  sVar187 = auVar228._6_2_;
  uVar213 = (ushort)(sVar177 < sVar187) * sVar177 | (ushort)(sVar177 >= sVar187) * sVar187;
  sVar187 = auVar228._8_2_;
  uVar214 = (ushort)(sVar180 < sVar187) * sVar180 | (ushort)(sVar180 >= sVar187) * sVar187;
  sVar187 = auVar228._10_2_;
  uVar215 = (ushort)(sVar183 < sVar187) * sVar183 | (ushort)(sVar183 >= sVar187) * sVar187;
  sVar187 = auVar228._12_2_;
  sVar193 = auVar228._14_2_;
  uVar216 = (ushort)(sVar185 < sVar187) * sVar185 | (ushort)(sVar185 >= sVar187) * sVar187;
  uVar217 = (ushort)(sVar186 < sVar193) * sVar186 | (ushort)(sVar186 >= sVar193) * sVar193;
  auVar322._0_2_ =
       (ushort)((short)uVar202 < sVar143) * sVar143 | ((short)uVar202 >= sVar143) * uVar202;
  auVar322._2_2_ =
       (ushort)((short)uVar211 < sVar156) * sVar156 | ((short)uVar211 >= sVar156) * uVar211;
  auVar322._4_2_ =
       (ushort)((short)uVar212 < sVar157) * sVar157 | ((short)uVar212 >= sVar157) * uVar212;
  auVar322._6_2_ =
       (ushort)((short)uVar213 < sVar158) * sVar158 | ((short)uVar213 >= sVar158) * uVar213;
  auVar322._8_2_ =
       (ushort)((short)uVar214 < sVar161) * sVar161 | ((short)uVar214 >= sVar161) * uVar214;
  auVar322._10_2_ =
       (ushort)((short)uVar215 < sVar164) * sVar164 | ((short)uVar215 >= sVar164) * uVar215;
  auVar322._12_2_ =
       (ushort)((short)uVar216 < sVar166) * sVar166 | ((short)uVar216 >= sVar166) * uVar216;
  auVar322._14_2_ =
       (ushort)((short)uVar217 < sVar167) * sVar167 | ((short)uVar217 >= sVar167) * uVar217;
  auVar228 = paddsw(_DAT_00509890,auVar322 & auVar286);
  auVar266 = paddsw(auVar322 & auVar286,_DAT_00515500);
  auVar299 = auVar299 & auVar286;
  sVar187 = auVar228._0_2_;
  uVar202 = (ushort)(sVar168 < sVar187) * sVar168 | (ushort)(sVar168 >= sVar187) * sVar187;
  sVar187 = auVar228._2_2_;
  uVar211 = (ushort)(sVar175 < sVar187) * sVar175 | (ushort)(sVar175 >= sVar187) * sVar187;
  sVar187 = auVar228._4_2_;
  uVar212 = (ushort)(sVar176 < sVar187) * sVar176 | (ushort)(sVar176 >= sVar187) * sVar187;
  sVar187 = auVar228._6_2_;
  uVar213 = (ushort)(sVar177 < sVar187) * sVar177 | (ushort)(sVar177 >= sVar187) * sVar187;
  sVar187 = auVar228._8_2_;
  uVar214 = (ushort)(sVar180 < sVar187) * sVar180 | (ushort)(sVar180 >= sVar187) * sVar187;
  sVar187 = auVar228._10_2_;
  uVar215 = (ushort)(sVar183 < sVar187) * sVar183 | (ushort)(sVar183 >= sVar187) * sVar187;
  sVar187 = auVar228._12_2_;
  sVar193 = auVar228._14_2_;
  uVar216 = (ushort)(sVar185 < sVar187) * sVar185 | (ushort)(sVar185 >= sVar187) * sVar187;
  uVar217 = (ushort)(sVar186 < sVar193) * sVar186 | (ushort)(sVar186 >= sVar193) * sVar193;
  auVar219._0_2_ =
       (ushort)((short)uVar202 < sVar143) * sVar143 | ((short)uVar202 >= sVar143) * uVar202;
  auVar219._2_2_ =
       (ushort)((short)uVar211 < sVar156) * sVar156 | ((short)uVar211 >= sVar156) * uVar211;
  auVar219._4_2_ =
       (ushort)((short)uVar212 < sVar157) * sVar157 | ((short)uVar212 >= sVar157) * uVar212;
  auVar219._6_2_ =
       (ushort)((short)uVar213 < sVar158) * sVar158 | ((short)uVar213 >= sVar158) * uVar213;
  auVar219._8_2_ =
       (ushort)((short)uVar214 < sVar161) * sVar161 | ((short)uVar214 >= sVar161) * uVar214;
  auVar219._10_2_ =
       (ushort)((short)uVar215 < sVar164) * sVar164 | ((short)uVar215 >= sVar164) * uVar215;
  auVar219._12_2_ =
       (ushort)((short)uVar216 < sVar166) * sVar166 | ((short)uVar216 >= sVar166) * uVar216;
  auVar219._14_2_ =
       (ushort)((short)uVar217 < sVar167) * sVar167 | ((short)uVar217 >= sVar167) * uVar217;
  sVar187 = auVar266._0_2_;
  uVar202 = (ushort)(sVar168 < sVar187) * sVar168 | (ushort)(sVar168 >= sVar187) * sVar187;
  sVar187 = auVar266._2_2_;
  uVar211 = (ushort)(sVar175 < sVar187) * sVar175 | (ushort)(sVar175 >= sVar187) * sVar187;
  sVar187 = auVar266._4_2_;
  uVar212 = (ushort)(sVar176 < sVar187) * sVar176 | (ushort)(sVar176 >= sVar187) * sVar187;
  sVar187 = auVar266._6_2_;
  uVar213 = (ushort)(sVar177 < sVar187) * sVar177 | (ushort)(sVar177 >= sVar187) * sVar187;
  sVar187 = auVar266._8_2_;
  uVar214 = (ushort)(sVar180 < sVar187) * sVar180 | (ushort)(sVar180 >= sVar187) * sVar187;
  sVar187 = auVar266._10_2_;
  uVar215 = (ushort)(sVar183 < sVar187) * sVar183 | (ushort)(sVar183 >= sVar187) * sVar187;
  sVar187 = auVar266._12_2_;
  sVar193 = auVar266._14_2_;
  uVar216 = (ushort)(sVar185 < sVar187) * sVar185 | (ushort)(sVar185 >= sVar187) * sVar187;
  uVar217 = (ushort)(sVar186 < sVar193) * sVar186 | (ushort)(sVar186 >= sVar193) * sVar193;
  auVar323._0_2_ =
       (ushort)((short)uVar202 < sVar143) * sVar143 | ((short)uVar202 >= sVar143) * uVar202;
  auVar323._2_2_ =
       (ushort)((short)uVar211 < sVar156) * sVar156 | ((short)uVar211 >= sVar156) * uVar211;
  auVar323._4_2_ =
       (ushort)((short)uVar212 < sVar157) * sVar157 | ((short)uVar212 >= sVar157) * uVar212;
  auVar323._6_2_ =
       (ushort)((short)uVar213 < sVar158) * sVar158 | ((short)uVar213 >= sVar158) * uVar213;
  auVar323._8_2_ =
       (ushort)((short)uVar214 < sVar161) * sVar161 | ((short)uVar214 >= sVar161) * uVar214;
  auVar323._10_2_ =
       (ushort)((short)uVar215 < sVar164) * sVar164 | ((short)uVar215 >= sVar164) * uVar215;
  auVar323._12_2_ =
       (ushort)((short)uVar216 < sVar166) * sVar166 | ((short)uVar216 >= sVar166) * uVar216;
  auVar323._14_2_ =
       (ushort)((short)uVar217 < sVar167) * sVar167 | ((short)uVar217 >= sVar167) * uVar217;
  auVar228 = psraw(auVar219,3);
  auVar266 = psraw(auVar323,3);
  auVar189 = psubsw(auVar189,auVar228);
  sVar187 = auVar189._0_2_;
  uVar202 = (ushort)(sVar168 < sVar187) * sVar168 | (ushort)(sVar168 >= sVar187) * sVar187;
  sVar187 = auVar189._2_2_;
  uVar211 = (ushort)(sVar175 < sVar187) * sVar175 | (ushort)(sVar175 >= sVar187) * sVar187;
  sVar187 = auVar189._4_2_;
  uVar212 = (ushort)(sVar176 < sVar187) * sVar176 | (ushort)(sVar176 >= sVar187) * sVar187;
  sVar187 = auVar189._6_2_;
  uVar213 = (ushort)(sVar177 < sVar187) * sVar177 | (ushort)(sVar177 >= sVar187) * sVar187;
  sVar187 = auVar189._8_2_;
  uVar214 = (ushort)(sVar180 < sVar187) * sVar180 | (ushort)(sVar180 >= sVar187) * sVar187;
  sVar187 = auVar189._10_2_;
  uVar215 = (ushort)(sVar183 < sVar187) * sVar183 | (ushort)(sVar183 >= sVar187) * sVar187;
  sVar187 = auVar189._12_2_;
  sVar193 = auVar189._14_2_;
  uVar216 = (ushort)(sVar185 < sVar187) * sVar185 | (ushort)(sVar185 >= sVar187) * sVar187;
  uVar217 = (ushort)(sVar186 < sVar193) * sVar186 | (ushort)(sVar186 >= sVar193) * sVar193;
  auVar190._0_2_ =
       (ushort)((short)uVar202 < sVar143) * sVar143 | ((short)uVar202 >= sVar143) * uVar202;
  auVar190._2_2_ =
       (ushort)((short)uVar211 < sVar156) * sVar156 | ((short)uVar211 >= sVar156) * uVar211;
  auVar190._4_2_ =
       (ushort)((short)uVar212 < sVar157) * sVar157 | ((short)uVar212 >= sVar157) * uVar212;
  auVar190._6_2_ =
       (ushort)((short)uVar213 < sVar158) * sVar158 | ((short)uVar213 >= sVar158) * uVar213;
  auVar190._8_2_ =
       (ushort)((short)uVar214 < sVar161) * sVar161 | ((short)uVar214 >= sVar161) * uVar214;
  auVar190._10_2_ =
       (ushort)((short)uVar215 < sVar164) * sVar164 | ((short)uVar215 >= sVar164) * uVar215;
  auVar190._12_2_ =
       (ushort)((short)uVar216 < sVar166) * sVar166 | ((short)uVar216 >= sVar166) * uVar216;
  auVar190._14_2_ =
       (ushort)((short)uVar217 < sVar167) * sVar167 | ((short)uVar217 >= sVar167) * uVar217;
  auVar170 = paddsw(auVar266,auVar170);
  sVar187 = auVar170._0_2_;
  uVar202 = (ushort)(sVar168 < sVar187) * sVar168 | (ushort)(sVar168 >= sVar187) * sVar187;
  sVar187 = auVar170._2_2_;
  uVar211 = (ushort)(sVar175 < sVar187) * sVar175 | (ushort)(sVar175 >= sVar187) * sVar187;
  sVar187 = auVar170._4_2_;
  uVar212 = (ushort)(sVar176 < sVar187) * sVar176 | (ushort)(sVar176 >= sVar187) * sVar187;
  sVar187 = auVar170._6_2_;
  uVar213 = (ushort)(sVar177 < sVar187) * sVar177 | (ushort)(sVar177 >= sVar187) * sVar187;
  sVar187 = auVar170._8_2_;
  uVar214 = (ushort)(sVar180 < sVar187) * sVar180 | (ushort)(sVar180 >= sVar187) * sVar187;
  sVar187 = auVar170._10_2_;
  uVar215 = (ushort)(sVar183 < sVar187) * sVar183 | (ushort)(sVar183 >= sVar187) * sVar187;
  sVar187 = auVar170._12_2_;
  sVar193 = auVar170._14_2_;
  uVar216 = (ushort)(sVar185 < sVar187) * sVar185 | (ushort)(sVar185 >= sVar187) * sVar187;
  uVar217 = (ushort)(sVar186 < sVar193) * sVar186 | (ushort)(sVar186 >= sVar193) * sVar193;
  auVar324._0_2_ =
       (ushort)((short)uVar202 < sVar143) * sVar143 | ((short)uVar202 >= sVar143) * uVar202;
  auVar324._2_2_ =
       (ushort)((short)uVar211 < sVar156) * sVar156 | ((short)uVar211 >= sVar156) * uVar211;
  auVar324._4_2_ =
       (ushort)((short)uVar212 < sVar157) * sVar157 | ((short)uVar212 >= sVar157) * uVar212;
  auVar324._6_2_ =
       (ushort)((short)uVar213 < sVar158) * sVar158 | ((short)uVar213 >= sVar158) * uVar213;
  auVar324._8_2_ =
       (ushort)((short)uVar214 < sVar161) * sVar161 | ((short)uVar214 >= sVar161) * uVar214;
  auVar324._10_2_ =
       (ushort)((short)uVar215 < sVar164) * sVar164 | ((short)uVar215 >= sVar164) * uVar215;
  auVar324._12_2_ =
       (ushort)((short)uVar216 < sVar166) * sVar166 | ((short)uVar216 >= sVar166) * uVar216;
  auVar324._14_2_ =
       (ushort)((short)uVar217 < sVar167) * sVar167 | ((short)uVar217 >= sVar167) * uVar217;
  local_298 = paddsw(auVar190,auVar208);
  local_278 = paddsw(auVar324,auVar208);
  auVar220._0_2_ = auVar228._0_2_ + 1;
  auVar220._2_2_ = auVar228._2_2_ + 1;
  auVar220._4_2_ = auVar228._4_2_ + 1;
  auVar220._6_2_ = auVar228._6_2_ + 1;
  auVar220._8_2_ = auVar228._8_2_ + 1;
  auVar220._10_2_ = auVar228._10_2_ + 1;
  auVar220._12_2_ = auVar228._12_2_ + 1;
  auVar220._14_2_ = auVar228._14_2_ + 1;
  auVar170 = psraw(auVar220,1);
  auVar189 = psubsw(auVar227,~auVar253 & auVar170);
  sVar187 = auVar189._0_2_;
  uVar202 = (ushort)(sVar168 < sVar187) * sVar168 | (ushort)(sVar168 >= sVar187) * sVar187;
  sVar187 = auVar189._2_2_;
  uVar211 = (ushort)(sVar175 < sVar187) * sVar175 | (ushort)(sVar175 >= sVar187) * sVar187;
  sVar187 = auVar189._4_2_;
  uVar212 = (ushort)(sVar176 < sVar187) * sVar176 | (ushort)(sVar176 >= sVar187) * sVar187;
  sVar187 = auVar189._6_2_;
  uVar213 = (ushort)(sVar177 < sVar187) * sVar177 | (ushort)(sVar177 >= sVar187) * sVar187;
  sVar187 = auVar189._8_2_;
  uVar214 = (ushort)(sVar180 < sVar187) * sVar180 | (ushort)(sVar180 >= sVar187) * sVar187;
  sVar187 = auVar189._10_2_;
  uVar215 = (ushort)(sVar183 < sVar187) * sVar183 | (ushort)(sVar183 >= sVar187) * sVar187;
  sVar187 = auVar189._12_2_;
  sVar193 = auVar189._14_2_;
  uVar216 = (ushort)(sVar185 < sVar187) * sVar185 | (ushort)(sVar185 >= sVar187) * sVar187;
  uVar217 = (ushort)(sVar186 < sVar193) * sVar186 | (ushort)(sVar186 >= sVar193) * sVar193;
  auVar316._0_2_ =
       (ushort)((short)uVar202 < sVar143) * sVar143 | ((short)uVar202 >= sVar143) * uVar202;
  auVar316._2_2_ =
       (ushort)((short)uVar211 < sVar156) * sVar156 | ((short)uVar211 >= sVar156) * uVar211;
  auVar316._4_2_ =
       (ushort)((short)uVar212 < sVar157) * sVar157 | ((short)uVar212 >= sVar157) * uVar212;
  auVar316._6_2_ =
       (ushort)((short)uVar213 < sVar158) * sVar158 | ((short)uVar213 >= sVar158) * uVar213;
  auVar316._8_2_ =
       (ushort)((short)uVar214 < sVar161) * sVar161 | ((short)uVar214 >= sVar161) * uVar214;
  auVar316._10_2_ =
       (ushort)((short)uVar215 < sVar164) * sVar164 | ((short)uVar215 >= sVar164) * uVar215;
  auVar316._12_2_ =
       (ushort)((short)uVar216 < sVar166) * sVar166 | ((short)uVar216 >= sVar166) * uVar216;
  auVar316._14_2_ =
       (ushort)((short)uVar217 < sVar167) * sVar167 | ((short)uVar217 >= sVar167) * uVar217;
  auVar170 = paddsw(~auVar253 & auVar170,auVar206);
  sVar187 = auVar170._0_2_;
  uVar202 = (ushort)(sVar168 < sVar187) * sVar168 | (ushort)(sVar168 >= sVar187) * sVar187;
  sVar168 = auVar170._2_2_;
  uVar211 = (ushort)(sVar175 < sVar168) * sVar175 | (ushort)(sVar175 >= sVar168) * sVar168;
  sVar168 = auVar170._4_2_;
  uVar212 = (ushort)(sVar176 < sVar168) * sVar176 | (ushort)(sVar176 >= sVar168) * sVar168;
  sVar168 = auVar170._6_2_;
  uVar213 = (ushort)(sVar177 < sVar168) * sVar177 | (ushort)(sVar177 >= sVar168) * sVar168;
  sVar168 = auVar170._8_2_;
  uVar214 = (ushort)(sVar180 < sVar168) * sVar180 | (ushort)(sVar180 >= sVar168) * sVar168;
  sVar168 = auVar170._10_2_;
  uVar215 = (ushort)(sVar183 < sVar168) * sVar183 | (ushort)(sVar183 >= sVar168) * sVar168;
  sVar168 = auVar170._12_2_;
  sVar175 = auVar170._14_2_;
  uVar216 = (ushort)(sVar185 < sVar168) * sVar185 | (ushort)(sVar185 >= sVar168) * sVar168;
  uVar217 = (ushort)(sVar186 < sVar175) * sVar186 | (ushort)(sVar186 >= sVar175) * sVar175;
  auVar254._0_2_ =
       (ushort)((short)uVar202 < sVar143) * sVar143 | ((short)uVar202 >= sVar143) * uVar202;
  auVar254._2_2_ =
       (ushort)((short)uVar211 < sVar156) * sVar156 | ((short)uVar211 >= sVar156) * uVar211;
  auVar254._4_2_ =
       (ushort)((short)uVar212 < sVar157) * sVar157 | ((short)uVar212 >= sVar157) * uVar212;
  auVar254._6_2_ =
       (ushort)((short)uVar213 < sVar158) * sVar158 | ((short)uVar213 >= sVar158) * uVar213;
  auVar254._8_2_ =
       (ushort)((short)uVar214 < sVar161) * sVar161 | ((short)uVar214 >= sVar161) * uVar214;
  auVar254._10_2_ =
       (ushort)((short)uVar215 < sVar164) * sVar164 | ((short)uVar215 >= sVar164) * uVar215;
  auVar254._12_2_ =
       (ushort)((short)uVar216 < sVar166) * sVar166 | ((short)uVar216 >= sVar166) * uVar216;
  auVar254._14_2_ =
       (ushort)((short)uVar217 < sVar167) * sVar167 | ((short)uVar217 >= sVar167) * uVar217;
  local_288 = paddsw(auVar316,auVar208);
  local_268 = paddsw(auVar254,auVar208);
  if ((((((((((((((((auVar299 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar299 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar299 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar299 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar299 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar299 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar299 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar299 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar299 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar299 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar299 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar299 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar299 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar299 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar299 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar299[0xf]) {
    local_398 = local_278._0_2_;
    sStack_396 = local_278._2_2_;
    sStack_394 = local_278._4_2_;
    sStack_392 = local_278._6_2_;
    sStack_390 = local_278._8_2_;
    uStack_38e = local_278._10_2_;
    sStack_38c = local_278._12_2_;
    uStack_38a = local_278._14_2_;
    local_328 = local_298._0_2_;
    uStack_326 = local_298._2_2_;
    sStack_324 = local_298._4_2_;
    uStack_322 = local_298._6_2_;
    sStack_320 = local_298._8_2_;
    uStack_31e = local_298._10_2_;
    sStack_31c = local_298._12_2_;
    uStack_31a = local_298._14_2_;
    local_388 = local_268._0_2_;
    uStack_386 = local_268._2_2_;
    sStack_384 = local_268._4_2_;
    uStack_382 = local_268._6_2_;
    sStack_380 = local_268._8_2_;
    uStack_37e = local_268._10_2_;
    sStack_37c = local_268._12_2_;
    uStack_37a = local_268._14_2_;
    local_318 = local_288._0_2_;
    uStack_316 = local_288._2_2_;
    sStack_314 = local_288._4_2_;
    uStack_312 = local_288._6_2_;
    sStack_310 = local_288._8_2_;
    uStack_30e = local_288._10_2_;
    sStack_30c = local_288._12_2_;
    uStack_30a = local_288._14_2_;
  }
  else {
    auVar170 = psubusw(auVar306,auVar150);
    auVar307._0_2_ = -(ushort)(auVar170._0_2_ == 0);
    auVar307._2_2_ = -(ushort)(auVar170._2_2_ == 0);
    auVar307._4_2_ = -(ushort)(auVar170._4_2_ == 0);
    auVar307._6_2_ = -(ushort)(auVar170._6_2_ == 0);
    auVar307._8_2_ = -(ushort)(auVar170._8_2_ == 0);
    auVar307._10_2_ = -(ushort)(auVar170._10_2_ == 0);
    auVar307._12_2_ = -(ushort)(auVar170._12_2_ == 0);
    auVar307._14_2_ = -(ushort)(auVar170._14_2_ == 0);
    sVar168 = local_388 + sVar162 + local_398;
    sVar175 = uStack_386 + uVar56 + sStack_396;
    sVar176 = sStack_384 + sVar181 + sStack_394;
    sVar177 = uStack_382 + uVar61 + sStack_392;
    sVar180 = sStack_380 + sVar198 + sStack_390;
    sVar183 = uStack_37e + uVar66 + uStack_38e;
    sVar185 = sStack_37c + sVar224 + sStack_38c;
    sVar186 = uStack_37a + uVar71 + uStack_38a;
    sVar187 = local_318 + sVar280 + local_328;
    sVar193 = uStack_316 + uVar72 + uStack_326;
    sVar194 = sStack_314 + sVar230 + sStack_324;
    sVar195 = uStack_312 + uVar78 + uStack_322;
    sVar197 = sStack_310 + sVar238 + sStack_320;
    sVar199 = uStack_30e + uVar84 + uStack_31e;
    sVar200 = sStack_30c + sVar259 + sStack_31c;
    sVar201 = uStack_30a + uVar90 + uStack_31a;
    sVar143 = sVar187 + sVar168 + 4;
    sVar156 = sVar193 + sVar175 + 4;
    sVar157 = sVar194 + sVar176 + 4;
    sVar158 = sVar195 + sVar177 + 4;
    sVar161 = sVar197 + sVar180 + 4;
    sVar164 = sVar199 + sVar183 + 4;
    sVar166 = sVar200 + sVar185 + 4;
    sVar167 = sVar201 + sVar186 + 4;
    local_1c8 = (ushort)(local_398 + sVar159 + sVar143) >> 3;
    uStack_1c6 = (ushort)(sStack_396 + uVar55 + sVar156) >> 3;
    uStack_1c4 = (ushort)(sStack_394 + sVar178 + sVar157) >> 3;
    uStack_1c2 = (ushort)(sStack_392 + uVar60 + sVar158) >> 3;
    uStack_1c0 = (ushort)(sStack_390 + sVar196 + sVar161) >> 3;
    uStack_1be = (ushort)(uStack_38e + uVar65 + sVar164) >> 3;
    uStack_1bc = (ushort)(sStack_38c + sVar223 + sVar166) >> 3;
    uStack_1ba = (ushort)(uStack_38a + uVar70 + sVar167) >> 3;
    local_1f8 = (ushort)(local_328 + sVar281 + sVar143) >> 3;
    uStack_1f6 = (ushort)(uStack_326 + uVar73 + sVar156) >> 3;
    uStack_1f4 = (ushort)(sStack_324 + sVar231 + sVar157) >> 3;
    uStack_1f2 = (ushort)(uStack_322 + uVar79 + sVar158) >> 3;
    uStack_1f0 = (ushort)(sStack_320 + sVar239 + sVar161) >> 3;
    uStack_1ee = (ushort)(uStack_31e + uVar85 + sVar164) >> 3;
    uStack_1ec = (ushort)(sStack_31c + sVar260 + sVar166) >> 3;
    uStack_1ea = (ushort)(uStack_31a + uVar91 + sVar167) >> 3;
    local_1b8 = (ushort)(local_388 + sVar159 * 2 + (sVar143 - sVar280)) >> 3;
    uStack_1b6 = (ushort)(uStack_386 + uVar55 * 2 + (sVar156 - uVar72)) >> 3;
    uStack_1b4 = (ushort)(sStack_384 + sVar178 * 2 + (sVar157 - sVar230)) >> 3;
    uStack_1b2 = (ushort)(uStack_382 + uVar60 * 2 + (sVar158 - uVar78)) >> 3;
    uStack_1b0 = (ushort)(sStack_380 + sVar196 * 2 + (sVar161 - sVar238)) >> 3;
    uStack_1ae = (ushort)(uStack_37e + uVar65 * 2 + (sVar164 - uVar84)) >> 3;
    uStack_1ac = (ushort)(sStack_37c + sVar223 * 2 + (sVar166 - sVar259)) >> 3;
    uStack_1aa = (ushort)(uStack_37a + uVar70 * 2 + (sVar167 - uVar90)) >> 3;
    local_1e8 = (ushort)(local_318 + sVar281 * 2 + (sVar143 - sVar162)) >> 3;
    uStack_1e6 = (ushort)(uStack_316 + uVar73 * 2 + (sVar156 - uVar56)) >> 3;
    uStack_1e4 = (ushort)(sStack_314 + sVar231 * 2 + (sVar157 - sVar181)) >> 3;
    uStack_1e2 = (ushort)(uStack_312 + uVar79 * 2 + (sVar158 - uVar61)) >> 3;
    uStack_1e0 = (ushort)(sStack_310 + sVar239 * 2 + (sVar161 - sVar198)) >> 3;
    uStack_1de = (ushort)(uStack_30e + uVar85 * 2 + (sVar164 - uVar66)) >> 3;
    uStack_1dc = (ushort)(sStack_30c + sVar260 * 2 + (sVar166 - sVar224)) >> 3;
    uStack_1da = (ushort)(uStack_30a + uVar91 * 2 + (sVar167 - uVar71)) >> 3;
    local_1a8._2_2_ = (ushort)(((uVar55 * 3 + uVar56) - uStack_316) + (sVar156 - uVar72)) >> 3;
    local_1a8._0_2_ = (ushort)(((sVar159 * 3 + sVar162) - local_318) + (sVar143 - sVar280)) >> 3;
    local_1a8._4_2_ = (ushort)(((sVar178 * 3 + sVar181) - sStack_314) + (sVar157 - sVar230)) >> 3;
    local_1a8._6_2_ = (ushort)(((uVar60 * 3 + uVar61) - uStack_312) + (sVar158 - uVar78)) >> 3;
    local_1a8._8_2_ = (ushort)(((sVar196 * 3 + sVar198) - sStack_310) + (sVar161 - sVar238)) >> 3;
    local_1a8._10_2_ = (ushort)(((uVar65 * 3 + uVar66) - uStack_30e) + (sVar164 - uVar84)) >> 3;
    local_1a8._12_2_ = (ushort)(((sVar223 * 3 + sVar224) - sStack_30c) + (sVar166 - sVar259)) >> 3;
    local_1a8._14_2_ = (ushort)(((uVar70 * 3 + uVar71) - uStack_30a) + (sVar167 - uVar90)) >> 3;
    auVar307 = auVar307 & auVar299;
    local_1d8._2_2_ = (ushort)(((uVar73 * 3 + uVar72) - uStack_386) + (sVar156 - uVar56)) >> 3;
    local_1d8._0_2_ = (ushort)(((sVar281 * 3 + sVar280) - local_388) + (sVar143 - sVar162)) >> 3;
    local_1d8._4_2_ = (ushort)(((sVar231 * 3 + sVar230) - sStack_384) + (sVar157 - sVar181)) >> 3;
    local_1d8._6_2_ = (ushort)(((uVar79 * 3 + uVar78) - uStack_382) + (sVar158 - uVar61)) >> 3;
    local_1d8._8_2_ = (ushort)(((sVar239 * 3 + sVar238) - sStack_380) + (sVar161 - sVar198)) >> 3;
    local_1d8._10_2_ = (ushort)(((uVar85 * 3 + uVar84) - uStack_37e) + (sVar164 - uVar66)) >> 3;
    local_1d8._12_2_ = (ushort)(((sVar260 * 3 + sVar259) - sStack_37c) + (sVar166 - sVar224)) >> 3;
    local_1d8._14_2_ = (ushort)(((uVar91 * 3 + uVar90) - uStack_37a) + (sVar167 - uVar71)) >> 3;
    if ((((((((((((((((auVar307 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar307 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar307 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar307 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar307 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar307 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar307 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar307 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar307 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar307 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar307 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar307 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar307 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar307 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar307 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar307[0xf] < '\0'
       ) {
      auVar100._4_2_ = sVar270;
      auVar100._0_4_ = auVar102._0_4_;
      auVar100._6_2_ = uVar58;
      auVar100._8_2_ = sVar278;
      auVar100._10_2_ = uVar63;
      auVar100._12_2_ = sVar295;
      auVar100._14_2_ = uVar68;
      auVar189 = psllw(auVar100,2);
      sVar143 = sVar258 + sVar159 + sVar281 + sVar318 + local_358 + sVar317 + sVar168 + sVar187 + 8;
      sVar156 = uVar54 + uVar55 + uVar73 + uVar75 + sStack_356 + uVar74 + sVar175 + sVar193 + 8;
      sVar157 = sVar271 + sVar178 + sVar231 + sVar163 + sStack_354 + sVar160 + sVar176 + sVar194 + 8
      ;
      sVar158 = uVar59 + uVar60 + uVar79 + uVar81 + sStack_352 + uVar80 + sVar177 + sVar195 + 8;
      sVar161 = sVar279 + sVar196 + sVar239 + sVar313 + sStack_350 + sVar312 + sVar180 + sVar197 + 8
      ;
      sVar164 = uVar64 + uVar65 + uVar85 + uVar87 + uStack_34e + uVar86 + sVar183 + sVar199 + 8;
      sVar166 = sVar296 + sVar223 + sVar260 + sVar182 + sStack_34c + sVar179 + sVar185 + sVar200 + 8
      ;
      sVar167 = uVar69 + uVar70 + uVar91 + uVar93 + uStack_34a + uVar92 + sVar186 + sVar201 + 8;
      uStack_88 = (ushort)(sVar257 + local_328 + sVar239 + local_398 + sVar143) >> 4;
      uStack_86 = (ushort)(uVar53 + uStack_326 + uVar85 + sStack_396 + sVar156) >> 4;
      uStack_84 = (ushort)(sVar270 + sStack_324 + sVar260 + sStack_394 + sVar157) >> 4;
      uStack_82 = (ushort)(uVar58 + uStack_322 + uVar91 + sStack_392 + sVar158) >> 4;
      p[0][0]._0_2_ = (ushort)(sVar278 + sStack_320 + sStack_380 + sStack_390 + sVar161) >> 4;
      p[0][0]._2_2_ = (ushort)(uVar63 + uStack_31e + uStack_37e + uStack_38e + sVar164) >> 4;
      p[0][0]._4_2_ = (ushort)(sVar295 + sStack_31c + sStack_37c + sStack_38c + sVar166) >> 4;
      p[0][0]._6_2_ = (ushort)(uVar68 + uStack_31a + uStack_37a + uStack_38a + sVar167) >> 4;
      auVar101._4_4_ = uStack_2c4;
      auVar101._0_4_ = local_2c8;
      auVar101._8_4_ = uStack_2c0;
      auVar101._12_4_ = auVar169._8_4_;
      local_e8 = (ushort)(sVar319 + local_398 + local_318 + local_328 + sVar143) >> 4;
      uStack_e6 = (ushort)(uVar76 + sStack_396 + uStack_316 + uStack_326 + sVar156) >> 4;
      uStack_e4 = (ushort)(sVar165 + sStack_394 + sStack_314 + sStack_324 + sVar157) >> 4;
      uStack_e2 = (ushort)(uVar82 + sStack_392 + uStack_312 + uStack_322 + sVar158) >> 4;
      uStack_e0 = (ushort)(sVar314 + sStack_390 + sStack_310 + sStack_320 + sVar161) >> 4;
      uStack_de = (ushort)(uVar88 + uStack_38e + uStack_30e + uStack_31e + sVar164) >> 4;
      uStack_dc = (ushort)(sVar184 + sStack_38c + sStack_30c + sStack_31c + sVar166) >> 4;
      uStack_da = (ushort)(uVar94 + uStack_38a + uStack_30a + uStack_31a + sVar167) >> 4;
      p[0][1]._0_2_ =
           (ushort)(sVar257 * 2 + sVar162 + local_398 + sVar239 + (sVar143 - sVar318)) >> 4;
      p[0][1]._2_2_ = (ushort)(uVar53 * 2 + uVar56 + sStack_396 + uVar85 + (sVar156 - uVar75)) >> 4;
      p[0][1]._4_2_ =
           (ushort)(sVar270 * 2 + sVar181 + sStack_394 + sVar260 + (sVar157 - sVar163)) >> 4;
      p[0][1]._6_2_ = (ushort)(uVar58 * 2 + uVar61 + sStack_392 + uVar91 + (sVar158 - uVar81)) >> 4;
      p[1][0]._0_2_ =
           (ushort)(sVar278 * 2 + sVar198 + sStack_390 + sStack_380 + (sVar161 - sVar313)) >> 4;
      p[1][0]._2_2_ =
           (ushort)(uVar63 * 2 + uVar66 + uStack_38e + uStack_37e + (sVar164 - uVar87)) >> 4;
      p[1][0]._4_2_ =
           (ushort)(sVar295 * 2 + sVar224 + sStack_38c + sStack_37c + (sVar166 - sVar182)) >> 4;
      p[1][0]._6_2_ =
           (ushort)(uVar68 * 2 + uVar71 + uStack_38a + uStack_37a + (sVar167 - uVar93)) >> 4;
      local_d8 = (ushort)(sVar319 * 2 + sVar280 + local_328 + local_318 + (sVar143 - sVar258)) >> 4;
      uStack_d6 = (ushort)(uVar76 * 2 + uVar72 + uStack_326 + uStack_316 + (sVar156 - uVar54)) >> 4;
      uStack_d4 = (ushort)(sVar165 * 2 + sVar230 + sStack_324 + sStack_314 + (sVar157 - sVar271)) >>
                  4;
      uStack_d2 = (ushort)(uVar82 * 2 + uVar78 + uStack_322 + uStack_312 + (sVar158 - uVar59)) >> 4;
      uStack_d0 = (ushort)(sVar314 * 2 + sVar238 + sStack_320 + sStack_310 + (sVar161 - sVar279)) >>
                  4;
      uStack_ce = (ushort)(uVar88 * 2 + uVar84 + uStack_31e + uStack_30e + (sVar164 - uVar64)) >> 4;
      uStack_cc = (ushort)(sVar184 * 2 + sVar259 + sStack_31c + sStack_30c + (sVar166 - sVar296)) >>
                  4;
      uStack_ca = (ushort)(uVar94 * 2 + uVar90 + uStack_31a + uStack_30a + (sVar167 - uVar69)) >> 4;
      sVar168 = (sVar143 - sVar318) - sVar317;
      sVar175 = (sVar156 - uVar75) - uVar74;
      sVar176 = (sVar157 - sVar163) - sVar160;
      sVar177 = (sVar158 - uVar81) - uVar80;
      sVar180 = (sVar161 - sVar313) - sVar312;
      sVar183 = (sVar164 - uVar87) - uVar86;
      sVar185 = (sVar166 - sVar182) - sVar179;
      sVar186 = (sVar167 - uVar93) - uVar92;
      p[1][1]._0_2_ = (ushort)(sVar257 * 3 + sVar162 + sVar159 + sVar239 + sVar168) >> 4;
      p[1][1]._2_2_ = (ushort)(uVar53 * 3 + uVar56 + uVar55 + uVar85 + sVar175) >> 4;
      p[1][1]._4_2_ = (ushort)(sVar270 * 3 + sVar181 + sVar178 + sVar260 + sVar176) >> 4;
      p[1][1]._6_2_ = (ushort)(uVar58 * 3 + uVar61 + uVar60 + uVar91 + sVar177) >> 4;
      p[2][0]._0_2_ = (ushort)(sVar278 * 3 + sVar198 + sVar196 + sStack_380 + sVar180) >> 4;
      p[2][0]._2_2_ = (ushort)(uVar63 * 3 + uVar66 + uVar65 + uStack_37e + sVar183) >> 4;
      p[2][0]._4_2_ = (ushort)(sVar295 * 3 + sVar224 + sVar223 + sStack_37c + sVar185) >> 4;
      p[2][0]._6_2_ = (ushort)(uVar68 * 3 + uVar71 + uVar70 + uStack_37a + sVar186) >> 4;
      sVar143 = (sVar143 - sVar258) - local_358;
      sVar156 = (sVar156 - uVar54) - sStack_356;
      sVar157 = (sVar157 - sVar271) - sStack_354;
      sVar158 = (sVar158 - uVar59) - sStack_352;
      sVar161 = (sVar161 - sVar279) - sStack_350;
      sVar164 = (sVar164 - uVar64) - uStack_34e;
      sVar166 = (sVar166 - sVar296) - sStack_34c;
      sVar167 = (sVar167 - uVar69) - uStack_34a;
      local_c8 = (ushort)(sVar319 * 3 + sVar280 + local_188 + local_318 + sVar143) >> 4;
      uStack_c6 = (ushort)(uVar76 * 3 + uVar72 + sStack_186 + uStack_316 + sVar156) >> 4;
      uStack_c4 = (ushort)(sVar165 * 3 + sVar230 + sStack_184 + sStack_314 + sVar157) >> 4;
      uStack_c2 = (ushort)(uVar82 * 3 + uVar78 + sStack_182 + uStack_312 + sVar158) >> 4;
      uStack_c0 = (ushort)(sVar314 * 3 + sVar238 + sVar281 + sStack_310 + sVar161) >> 4;
      uStack_be = (ushort)(uVar88 * 3 + uVar84 + uVar73 + uStack_30e + sVar164) >> 4;
      uStack_bc = (ushort)(sVar184 * 3 + sVar259 + sVar231 + sStack_30c + sVar166) >> 4;
      uStack_ba = (ushort)(uVar94 * 3 + uVar90 + uVar79 + uStack_30a + sVar167) >> 4;
      sVar168 = sVar168 - local_188;
      sVar175 = sVar175 - sStack_186;
      sVar176 = sVar176 - sStack_184;
      sVar177 = sVar177 - sStack_182;
      sVar180 = sVar180 - sVar281;
      sVar183 = sVar183 - uVar73;
      sVar185 = sVar185 - sVar231;
      sVar186 = sVar186 - uVar79;
      sVar143 = sVar143 - sVar159;
      sVar156 = sVar156 - uVar55;
      sVar157 = sVar157 - sVar178;
      sVar158 = sVar158 - uVar60;
      sVar161 = sVar161 - sVar196;
      sVar164 = sVar164 - uVar65;
      sVar166 = sVar166 - sVar223;
      sVar167 = sVar167 - uVar70;
      p[2][1]._0_2_ = (ushort)(sVar162 + sVar159 + auVar189._0_2_ + local_358 + sVar168) >> 4;
      p[2][1]._2_2_ = (ushort)(uVar56 + uVar55 + auVar189._2_2_ + sStack_356 + sVar175) >> 4;
      p[2][1]._4_2_ = (ushort)(sVar181 + sVar178 + auVar189._4_2_ + sStack_354 + sVar176) >> 4;
      p[2][1]._6_2_ = (ushort)(uVar61 + uVar60 + auVar189._6_2_ + sStack_352 + sVar177) >> 4;
      p[3][0]._0_2_ = (ushort)(sVar198 + sVar196 + auVar189._8_2_ + sStack_350 + sVar180) >> 4;
      p[3][0]._2_2_ = (ushort)(uVar66 + uVar65 + auVar189._10_2_ + uStack_34e + sVar183) >> 4;
      p[3][0]._4_2_ = (ushort)(sVar224 + sVar223 + auVar189._12_2_ + sStack_34c + sVar185) >> 4;
      p[3][0]._6_2_ = (ushort)(uVar71 + uVar70 + auVar189._14_2_ + uStack_34a + sVar186) >> 4;
      auVar170 = psllw(auVar101,2);
      local_b8 = (ushort)(sVar280 + local_188 + auVar170._0_2_ + sVar317 + sVar143) >> 4;
      uStack_b6 = (ushort)(uVar72 + sStack_186 + auVar170._2_2_ + uVar74 + sVar156) >> 4;
      uStack_b4 = (ushort)(sVar230 + sStack_184 + auVar170._4_2_ + sVar160 + sVar157) >> 4;
      uStack_b2 = (ushort)(uVar78 + sStack_182 + auVar170._6_2_ + uVar80 + sVar158) >> 4;
      uStack_b0 = (ushort)(sVar238 + sVar281 + auVar170._8_2_ + sVar312 + sVar161) >> 4;
      uStack_ae = (ushort)(uVar84 + uVar73 + auVar170._10_2_ + uVar86 + sVar164) >> 4;
      uStack_ac = (ushort)(sVar259 + sVar231 + auVar170._12_2_ + sVar179 + sVar166) >> 4;
      uStack_aa = (ushort)(uVar90 + uVar79 + auVar170._14_2_ + uVar92 + sVar167) >> 4;
      sVar168 = sVar168 - sVar280;
      sVar175 = sVar175 - uVar72;
      sVar176 = sVar176 - sVar230;
      sVar177 = sVar177 - uVar78;
      sVar180 = sVar180 - sVar238;
      sVar183 = sVar183 - uVar84;
      sVar185 = sVar185 - sVar259;
      sVar186 = sVar186 - uVar90;
      sVar143 = sVar143 - sVar162;
      sVar156 = sVar156 - uVar56;
      sVar157 = sVar157 - sVar181;
      sVar158 = sVar158 - uVar61;
      sVar161 = sVar161 - sVar198;
      sVar164 = sVar164 - uVar66;
      sVar166 = sVar166 - sVar224;
      sVar167 = sVar167 - uVar71;
      p[3][1]._0_2_ =
           (ushort)(auVar189._0_2_ + sVar257 + sVar258 + sVar159 + local_358 + sVar168) >> 4;
      p[3][1]._2_2_ =
           (ushort)(auVar189._2_2_ + uVar53 + uVar54 + uVar55 + sStack_356 + sVar175) >> 4;
      p[3][1]._4_2_ =
           (ushort)(auVar189._4_2_ + sVar270 + sVar271 + sVar178 + sStack_354 + sVar176) >> 4;
      p[3][1]._6_2_ =
           (ushort)(auVar189._6_2_ + uVar58 + uVar59 + uVar60 + sStack_352 + sVar177) >> 4;
      p[4][0]._0_2_ =
           (ushort)(auVar189._8_2_ + sVar278 + sVar279 + sVar196 + sStack_350 + sVar180) >> 4;
      p[4][0]._2_2_ =
           (ushort)(auVar189._10_2_ + uVar63 + uVar64 + uVar65 + uStack_34e + sVar183) >> 4;
      p[4][0]._4_2_ =
           (ushort)(auVar189._12_2_ + sVar295 + sVar296 + sVar223 + sStack_34c + sVar185) >> 4;
      p[4][0]._6_2_ =
           (ushort)(auVar189._14_2_ + uVar68 + uVar69 + uVar70 + uStack_34a + sVar186) >> 4;
      local_a8 = (ushort)(auVar170._0_2_ + sVar319 + sVar281 + sVar318 + sVar317 + sVar143) >> 4;
      uStack_a6 = (ushort)(auVar170._2_2_ + uVar76 + uVar73 + uVar75 + uVar74 + sVar156) >> 4;
      uStack_a4 = (ushort)(auVar170._4_2_ + sVar165 + sVar231 + sVar163 + sVar160 + sVar157) >> 4;
      uStack_a2 = (ushort)(auVar170._6_2_ + uVar82 + uVar79 + uVar81 + uVar80 + sVar158) >> 4;
      uStack_a0 = (ushort)(auVar170._8_2_ + sVar314 + sVar239 + sVar313 + sVar312 + sVar161) >> 4;
      uStack_9e = (ushort)(auVar170._10_2_ + uVar88 + uVar85 + uVar87 + uVar86 + sVar164) >> 4;
      uStack_9c = (ushort)(auVar170._12_2_ + sVar184 + sVar260 + sVar182 + sVar179 + sVar166) >> 4;
      uStack_9a = (ushort)(auVar170._14_2_ + uVar94 + uVar91 + uVar93 + uVar92 + sVar167) >> 4;
      p[4][1]._0_2_ = (ushort)(((sVar258 + sVar257 * 7 + local_358) - local_318) + sVar168) >> 4;
      p[4][1]._2_2_ = (ushort)(((uVar54 + uVar53 * 7 + sStack_356) - uStack_316) + sVar175) >> 4;
      p[4][1]._4_2_ = (ushort)(((sVar271 + sVar270 * 7 + sStack_354) - sStack_314) + sVar176) >> 4;
      p[4][1]._6_2_ = (ushort)(((uVar59 + uVar58 * 7 + sStack_352) - uStack_312) + sVar177) >> 4;
      p[5][0]._0_2_ = (ushort)(((sVar279 + sVar278 * 7 + sStack_350) - sStack_310) + sVar180) >> 4;
      p[5][0]._2_2_ = (ushort)(((uVar64 + uVar63 * 7 + uStack_34e) - uStack_30e) + sVar183) >> 4;
      p[5][0]._4_2_ = (ushort)(((sVar296 + sVar295 * 7 + sStack_34c) - sStack_30c) + sVar185) >> 4;
      p[5][0]._6_2_ = (ushort)(((uVar69 + uVar68 * 7 + uStack_34a) - uStack_30a) + sVar186) >> 4;
      local_98 = (ushort)(((sVar318 + sVar319 * 7 + sVar317) - sVar239) + sVar143) >> 4;
      uStack_96 = (ushort)(((uVar75 + uVar76 * 7 + uVar74) - uVar85) + sVar156) >> 4;
      uStack_94 = (ushort)(((sVar163 + sVar165 * 7 + sVar160) - sVar260) + sVar157) >> 4;
      uStack_92 = (ushort)(((uVar81 + uVar82 * 7 + uVar80) - uVar91) + sVar158) >> 4;
      uStack_90 = (ushort)(((sVar313 + sVar314 * 7 + sVar312) - sStack_380) + sVar161) >> 4;
      uStack_8e = (ushort)(((uVar87 + uVar88 * 7 + uVar86) - uStack_37e) + sVar164) >> 4;
      uStack_8c = (ushort)(((sVar182 + sVar184 * 7 + sVar179) - sStack_37c) + sVar166) >> 4;
      uStack_8a = (ushort)(((uVar93 + uVar94 * 7 + uVar92) - uStack_37a) + sVar167) >> 4;
    }
    auVar151._8_4_ = 0xffffffff;
    auVar151._0_8_ = 0xffffffffffffffff;
    auVar151._12_4_ = 0xffffffff;
    lVar136 = 0;
    do {
      auVar170 = *(undefined1 (*) [16])(local_278 + lVar136) & (auVar151 ^ auVar299);
      *(undefined1 (*) [16])(local_278 + lVar136) = auVar170;
      auVar189 = *(undefined1 (*) [16])((long)&local_1c8 + lVar136) & auVar299;
      *(undefined1 (*) [16])((long)&local_1c8 + lVar136) = auVar189;
      *(undefined1 (*) [16])((long)&local_398 + lVar136) = auVar189 | auVar170;
      auVar170 = *(undefined1 (*) [16])(local_298 + lVar136) & (auVar151 ^ auVar299);
      *(undefined1 (*) [16])(local_298 + lVar136) = auVar170;
      auVar189 = *(undefined1 (*) [16])((long)&local_1f8 + lVar136) & auVar299;
      *(undefined1 (*) [16])((long)&local_1f8 + lVar136) = auVar189;
      *(undefined1 (*) [16])((long)&local_328 + lVar136) = auVar189 | auVar170;
      lVar136 = lVar136 + 0x10;
    } while (lVar136 == 0x10);
    auVar152._8_4_ = 0xffffffff;
    auVar152._0_8_ = 0xffffffffffffffff;
    auVar152._12_4_ = 0xffffffff;
    local_378 = local_1a8 & auVar299 | ~auVar299 & local_378;
    local_308 = local_1d8 & auVar299 | ~auVar299 & local_308;
    lVar136 = 0;
    do {
      auVar170 = *(undefined1 (*) [16])(local_278 + lVar136) & (auVar152 ^ auVar299);
      *(undefined1 (*) [16])(local_278 + lVar136) = auVar170;
      auVar189 = *(undefined1 (*) [16])((long)&local_1c8 + lVar136) & auVar299;
      *(undefined1 (*) [16])((long)&local_1c8 + lVar136) = auVar189;
      *(undefined1 (*) [16])((long)&local_398 + lVar136) = auVar189 | auVar170;
      auVar170 = *(undefined1 (*) [16])(local_298 + lVar136) & (auVar152 ^ auVar299);
      *(undefined1 (*) [16])(local_298 + lVar136) = auVar170;
      auVar189 = *(undefined1 (*) [16])((long)&local_1f8 + lVar136) & auVar299;
      *(undefined1 (*) [16])((long)&local_1f8 + lVar136) = auVar189;
      *(undefined1 (*) [16])((long)&local_328 + lVar136) = auVar189 | auVar170;
      lVar136 = lVar136 + 0x10;
    } while (lVar136 == 0x10);
    if ((((((((((((((((auVar307 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar307 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar307 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar307 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar307 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar307 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar307 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar307 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar307 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar307 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar307 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar307 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar307 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar307 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar307 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar307[0xf] < '\0'
       ) {
      auVar153._8_4_ = 0xffffffff;
      auVar153._0_8_ = 0xffffffffffffffff;
      auVar153._12_4_ = 0xffffffff;
      lVar136 = 0;
      do {
        auVar170 = *(undefined1 (*) [16])((long)&uStack_88 + lVar136) & auVar307;
        *(undefined1 (*) [16])((long)&uStack_88 + lVar136) = auVar170;
        *(undefined1 (*) [16])((long)&local_398 + lVar136) =
             auVar170 | *(undefined1 (*) [16])((long)&local_398 + lVar136) & (auVar153 ^ auVar307);
        auVar170 = *(undefined1 (*) [16])((long)&local_e8 + lVar136) & auVar307;
        *(undefined1 (*) [16])((long)&local_e8 + lVar136) = auVar170;
        *(undefined1 (*) [16])((long)&local_328 + lVar136) =
             auVar170 | *(undefined1 (*) [16])((long)&local_328 + lVar136) & (auVar153 ^ auVar307);
        lVar136 = lVar136 + 0x10;
      } while (lVar136 != 0x60);
    }
  }
  auVar133._4_8_ = auVar297._8_8_;
  auVar133._0_4_ = uVar145;
  auVar133._12_4_ = 0;
  auVar310._0_12_ = SUB1612(auVar133 << 0x20,0);
  auVar310._12_2_ = uVar57;
  auVar310._14_2_ = uVar58;
  auVar309._12_4_ = auVar310._12_4_;
  auVar309._0_10_ = SUB1610(auVar133 << 0x20,0);
  auVar309._10_2_ = sVar270;
  auVar134._4_2_ = auVar4._0_2_;
  auVar134._0_4_ = uVar145;
  auVar134._6_6_ = auVar309._10_6_;
  auVar113._4_8_ = auVar134._4_8_;
  auVar113._2_2_ = uVar53;
  auVar113._0_2_ = uVar52;
  auVar308._0_4_ = auVar3._0_4_;
  auVar308._4_12_ = auVar113;
  auVar97._8_4_ = uStack_340;
  auVar97._0_8_ = CONCAT44(uStack_344,local_348);
  auVar173._12_2_ = (short)((uint)uStack_344 >> 0x10);
  auVar173._0_12_ = auVar97;
  auVar173._14_2_ = sStack_352;
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._0_10_ = auVar97._0_10_;
  auVar172._10_2_ = sStack_354;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = (short)uStack_344;
  auVar171._0_8_ = CONCAT44(uStack_344,local_348);
  auVar114._4_8_ = auVar171._8_8_;
  auVar114._2_2_ = sStack_356;
  auVar114._0_2_ = (short)((uint)local_348 >> 0x10);
  auVar3._8_8_ = uStack_360;
  auVar3._0_8_ = local_368;
  auVar290._0_12_ = auVar3._0_12_;
  auVar290._12_2_ = (short)((ulong)local_368 >> 0x30);
  auVar290._14_2_ = local_378._6_2_;
  auVar289._12_4_ = auVar290._12_4_;
  auVar289._0_10_ = auVar3._0_10_;
  auVar289._10_2_ = local_378._4_2_;
  auVar288._10_6_ = auVar289._10_6_;
  auVar288._8_2_ = (short)((ulong)local_368 >> 0x20);
  auVar288._0_8_ = local_368;
  auVar115._4_8_ = auVar288._8_8_;
  auVar115._2_2_ = local_378._2_2_;
  auVar115._0_2_ = (short)((ulong)local_368 >> 0x10);
  auVar287._0_4_ = CONCAT22(local_378._0_2_,(short)local_368);
  auVar287._4_12_ = auVar115;
  Var135 = CONCAT64(CONCAT42(CONCAT22(sStack_392,uStack_382),sStack_394),
                    CONCAT22(sStack_384,uStack_382));
  auVar116._4_8_ = (long)((unkuint10)Var135 >> 0x10);
  auVar116._2_2_ = sStack_396;
  auVar116._0_2_ = uStack_386;
  auVar221._0_8_ = auVar308._0_8_;
  auVar221._8_4_ = auVar113._0_4_;
  auVar221._12_4_ = auVar114._0_4_;
  auVar236._0_8_ = auVar287._0_8_;
  auVar236._8_4_ = auVar115._0_4_;
  auVar236._12_4_ = auVar116._0_4_;
  auVar232._0_8_ = CONCAT26(uVar63,CONCAT24(uVar62,auVar155._0_4_));
  auVar232._8_2_ = auVar154._0_2_;
  auVar232._10_2_ = sVar295;
  auVar237._12_2_ = uVar67;
  auVar237._0_12_ = auVar232;
  auVar237._14_2_ = uVar68;
  uVar145 = CONCAT22(sStack_350,(short)uStack_340);
  auVar148._0_8_ = CONCAT26(uStack_34e,CONCAT24((short)((uint)uStack_340 >> 0x10),uVar145));
  auVar148._8_2_ = (short)uStack_33c;
  auVar148._10_2_ = sStack_34c;
  auVar154._12_2_ = (short)((uint)uStack_33c >> 0x10);
  auVar154._0_12_ = auVar148;
  auVar154._14_2_ = uStack_34a;
  uVar144 = CONCAT22(local_378._8_2_,(short)uStack_360);
  auVar188._0_8_ = CONCAT26(local_378._10_2_,CONCAT24((short)((ulong)uStack_360 >> 0x10),uVar144));
  auVar188._8_2_ = (short)((ulong)uStack_360 >> 0x20);
  auVar188._10_2_ = local_378._12_2_;
  auVar191._12_2_ = (short)((ulong)uStack_360 >> 0x30);
  auVar191._0_12_ = auVar188;
  auVar191._14_2_ = local_378._14_2_;
  auVar203._0_8_ = CONCAT26(uStack_38e,CONCAT24(uStack_37e,CONCAT22(sStack_390,sStack_380)));
  auVar203._8_2_ = sStack_37c;
  auVar203._10_2_ = sStack_38c;
  auVar209._12_2_ = uStack_37a;
  auVar209._0_12_ = auVar203;
  auVar209._14_2_ = uStack_38a;
  auVar241._8_4_ = (int)((ulong)auVar232._0_8_ >> 0x20);
  auVar241._0_8_ = auVar232._0_8_;
  auVar241._12_4_ = (int)((ulong)auVar148._0_8_ >> 0x20);
  auVar255._8_4_ = (int)((ulong)auVar188._0_8_ >> 0x20);
  auVar255._0_8_ = auVar188._0_8_;
  auVar255._12_4_ = (int)((ulong)auVar203._0_8_ >> 0x20);
  *(ulong *)(s + -8) = CONCAT44(CONCAT22(local_358,(short)local_348),auVar308._0_4_);
  *(ulong *)(s + -4) = CONCAT44(CONCAT22(local_398,local_388),auVar287._0_4_);
  *(long *)(s + (long)pitch + -8) = auVar221._8_8_;
  *(long *)(s + (long)pitch + -8 + 4) = auVar236._8_8_;
  puVar1 = s + lVar138 + -8;
  *(int *)puVar1 = auVar134._4_4_;
  *(int *)(puVar1 + 2) = auVar171._8_4_;
  *(int *)(puVar1 + 4) = auVar288._8_4_;
  *(int *)(puVar1 + 6) = (int)((unkuint10)Var135 >> 0x10);
  *(undefined4 *)(s + lVar139 + -4) = auVar309._12_4_;
  *(undefined4 *)(s + lVar139 + -2) = auVar172._12_4_;
  *(undefined4 *)(s + lVar139) = auVar289._12_4_;
  *(uint *)(s + lVar139 + 2) = CONCAT22(sStack_392,uStack_382);
  *(ulong *)(s + lVar140 + -8) = CONCAT44(uVar145,auVar155._0_4_);
  *(ulong *)(s + lVar140 + -8 + 4) = CONCAT44(CONCAT22(sStack_390,sStack_380),uVar144);
  *(long *)(s + lVar137 + -8) = auVar241._8_8_;
  *(long *)(s + lVar137 + -8 + 4) = auVar255._8_8_;
  puVar1 = s + lVar141 + -8;
  *(int *)puVar1 = auVar232._8_4_;
  *(int *)(puVar1 + 2) = auVar148._8_4_;
  *(int *)(puVar1 + 4) = auVar188._8_4_;
  *(int *)(puVar1 + 6) = auVar203._8_4_;
  *(int *)(s + lVar142 + -4) = auVar237._12_4_;
  *(int *)(s + lVar142 + -2) = auVar154._12_4_;
  *(int *)(s + lVar142) = auVar191._12_4_;
  *(int *)(s + lVar142 + 2) = auVar209._12_4_;
  Var135 = CONCAT64(CONCAT42(CONCAT22(uStack_312,uStack_322),sStack_314),
                    CONCAT22(sStack_324,uStack_322));
  auVar117._4_8_ = (long)((unkuint10)Var135 >> 0x10);
  auVar117._2_2_ = uStack_316;
  auVar117._0_2_ = uStack_326;
  auVar192._0_4_ = CONCAT22(local_318,local_328);
  auVar192._4_12_ = auVar117;
  auVar269._0_12_ = local_308._0_12_;
  auVar269._12_2_ = local_308._6_2_;
  auVar269._14_2_ = uStack_2f2;
  auVar268._12_4_ = auVar269._12_4_;
  auVar268._0_10_ = local_308._0_10_;
  auVar268._10_2_ = uStack_2f4;
  auVar267._10_6_ = auVar268._10_6_;
  auVar267._0_8_ = local_308._0_8_;
  auVar267._8_2_ = local_308._4_2_;
  auVar118._4_8_ = auVar267._8_8_;
  auVar118._2_2_ = uStack_2f6;
  auVar118._0_2_ = local_308._2_2_;
  auVar4._8_8_ = uStack_2e0;
  auVar4._0_8_ = CONCAT44(uStack_2e4,local_2e8);
  auVar294._0_12_ = auVar4._0_12_;
  auVar294._12_2_ = (short)((uint)uStack_2e4 >> 0x10);
  auVar294._14_2_ = local_2d8._6_2_;
  auVar293._12_4_ = auVar294._12_4_;
  auVar293._0_10_ = auVar4._0_10_;
  auVar293._10_2_ = local_2d8._4_2_;
  auVar292._10_6_ = auVar293._10_6_;
  auVar292._8_2_ = (short)uStack_2e4;
  auVar292._0_8_ = CONCAT44(uStack_2e4,local_2e8);
  auVar119._4_8_ = auVar292._8_8_;
  auVar119._2_2_ = local_2d8._2_2_;
  auVar119._0_2_ = (short)((uint)local_2e8 >> 0x10);
  auVar291._0_4_ = CONCAT22((undefined2)local_2d8,(short)local_2e8);
  auVar291._4_12_ = auVar119;
  auVar99._8_4_ = uStack_2c0;
  auVar99._0_8_ = CONCAT44(uStack_2c4,local_2c8);
  auVar302._12_2_ = uVar82;
  auVar302._0_12_ = auVar99;
  auVar302._14_2_ = uVar83;
  auVar301._12_4_ = auVar302._12_4_;
  auVar301._0_10_ = auVar99._0_10_;
  auVar301._10_2_ = auVar226._14_2_;
  auVar300._10_6_ = auVar301._10_6_;
  auVar300._8_2_ = sVar165;
  auVar300._0_8_ = CONCAT44(uStack_2c4,local_2c8);
  auVar120._4_8_ = auVar300._8_8_;
  auVar120._2_2_ = uVar77;
  auVar120._0_2_ = uVar76;
  auVar174._0_8_ = auVar192._0_8_;
  auVar174._8_4_ = auVar117._0_4_;
  auVar174._12_4_ = auVar118._0_4_;
  auVar311._0_8_ = auVar291._0_8_;
  auVar311._8_4_ = auVar119._0_4_;
  auVar311._12_4_ = auVar120._0_4_;
  auVar149._0_8_ = CONCAT26(uStack_30e,CONCAT24(uStack_31e,CONCAT22(sStack_310,sStack_320)));
  auVar149._8_2_ = sStack_31c;
  auVar149._10_2_ = sStack_30c;
  auVar155._12_2_ = uStack_31a;
  auVar155._0_12_ = auVar149;
  auVar155._14_2_ = uStack_30a;
  uVar145 = CONCAT22((undefined2)uStack_2f0,local_308._8_2_);
  auVar204._0_8_ = CONCAT26(uStack_2f0._2_2_,CONCAT24(local_308._10_2_,uVar145));
  auVar204._8_2_ = local_308._12_2_;
  auVar204._10_2_ = (undefined2)uStack_2ec;
  auVar210._12_2_ = local_308._14_2_;
  auVar210._0_12_ = auVar204;
  auVar210._14_2_ = uStack_2ec._2_2_;
  uVar144 = CONCAT22((undefined2)uStack_2d0,(short)uStack_2e0);
  auVar218._0_8_ = CONCAT26(uStack_2d0._2_2_,CONCAT24((short)((ulong)uStack_2e0 >> 0x10),uVar144));
  auVar218._8_2_ = (short)((ulong)uStack_2e0 >> 0x20);
  auVar218._10_2_ = uStack_2d0._4_2_;
  auVar222._12_2_ = (short)((ulong)uStack_2e0 >> 0x30);
  auVar222._0_12_ = auVar218;
  auVar222._14_2_ = uStack_2d0._6_2_;
  auVar225._0_8_ = CONCAT26(uVar89,CONCAT24(uVar88,auVar245._12_4_));
  auVar225._8_2_ = sVar184;
  auVar225._10_2_ = auVar244._14_2_;
  auVar229._12_2_ = uVar94;
  auVar229._0_12_ = auVar225;
  auVar229._14_2_ = uVar95;
  auVar242._8_4_ = (int)((ulong)auVar149._0_8_ >> 0x20);
  auVar242._0_8_ = auVar149._0_8_;
  auVar242._12_4_ = (int)((ulong)auVar204._0_8_ >> 0x20);
  auVar256._8_4_ = (int)((ulong)auVar218._0_8_ >> 0x20);
  auVar256._0_8_ = auVar218._0_8_;
  auVar256._12_4_ = (int)((ulong)auVar225._0_8_ >> 0x20);
  *(ulong *)s = CONCAT44(CONCAT22(local_2f8,local_308._0_2_),auVar192._0_4_);
  *(ulong *)(s + 4) = CONCAT44(auVar205._12_4_,auVar291._0_4_);
  *(long *)(s + pitch) = auVar174._8_8_;
  *(long *)(s + pitch + 4) = auVar311._8_8_;
  puVar1 = s + lVar138;
  *(int *)puVar1 = (int)((unkuint10)Var135 >> 0x10);
  *(int *)(puVar1 + 2) = auVar267._8_4_;
  *(int *)(puVar1 + 4) = auVar292._8_4_;
  *(int *)(puVar1 + 6) = auVar300._8_4_;
  *(uint *)(s + lVar139 + 4) = CONCAT22(uStack_312,uStack_322);
  *(undefined4 *)(s + lVar139 + 6) = auVar268._12_4_;
  *(undefined4 *)(s + lVar139 + 8) = auVar293._12_4_;
  *(undefined4 *)(s + lVar139 + 10) = auVar301._12_4_;
  *(ulong *)(s + lVar140) = CONCAT44(uVar145,CONCAT22(sStack_310,sStack_320));
  *(ulong *)(s + lVar140 + 4) = CONCAT44(auVar245._12_4_,uVar144);
  *(long *)(s + lVar137) = auVar242._8_8_;
  *(long *)(s + lVar137 + 4) = auVar256._8_8_;
  puVar1 = s + lVar141;
  *(int *)puVar1 = auVar149._8_4_;
  *(int *)(puVar1 + 2) = auVar204._8_4_;
  *(int *)(puVar1 + 4) = auVar218._8_4_;
  *(int *)(puVar1 + 6) = auVar225._8_4_;
  *(int *)(s + lVar142 + 4) = auVar155._12_4_;
  *(int *)(s + lVar142 + 6) = auVar210._12_4_;
  *(int *)(s + lVar142 + 8) = auVar222._12_4_;
  *(int *)(s + lVar142 + 10) = auVar229._12_4_;
  return;
}

Assistant:

void aom_highbd_lpf_vertical_14_dual_sse2(
    uint16_t *s, int pitch, const uint8_t *blimit0, const uint8_t *limit0,
    const uint8_t *thresh0, const uint8_t *blimit1, const uint8_t *limit1,
    const uint8_t *thresh1, int bd) {
  __m128i q[7], p[7];
  __m128i p6, p5, p4, p3, p2, p1, p0, q0;
  __m128i p6_2, p5_2, p4_2, p3_2, p2_2, p1_2, q0_2, p0_2;
  __m128i d0, d7;
  __m128i d0_out, d1_out, d2_out, d3_out, d4_out, d5_out, d6_out, d7_out;

  p6 = _mm_loadu_si128((__m128i *)((s - 8) + 0 * pitch));
  p5 = _mm_loadu_si128((__m128i *)((s - 8) + 1 * pitch));
  p4 = _mm_loadu_si128((__m128i *)((s - 8) + 2 * pitch));
  p3 = _mm_loadu_si128((__m128i *)((s - 8) + 3 * pitch));
  p2 = _mm_loadu_si128((__m128i *)((s - 8) + 4 * pitch));
  p1 = _mm_loadu_si128((__m128i *)((s - 8) + 5 * pitch));
  p0 = _mm_loadu_si128((__m128i *)((s - 8) + 6 * pitch));
  q0 = _mm_loadu_si128((__m128i *)((s - 8) + 7 * pitch));

  highbd_transpose8x8_sse2(&p6, &p5, &p4, &p3, &p2, &p1, &p0, &q0, &d0, &p[6],
                           &p[5], &p[4], &p[3], &p[2], &p[1], &p[0]);

  p6_2 = _mm_loadu_si128((__m128i *)(s + 0 * pitch));
  p5_2 = _mm_loadu_si128((__m128i *)(s + 1 * pitch));
  p4_2 = _mm_loadu_si128((__m128i *)(s + 2 * pitch));
  p3_2 = _mm_loadu_si128((__m128i *)(s + 3 * pitch));
  p2_2 = _mm_loadu_si128((__m128i *)(s + 4 * pitch));
  p1_2 = _mm_loadu_si128((__m128i *)(s + 5 * pitch));
  p0_2 = _mm_loadu_si128((__m128i *)(s + 6 * pitch));
  q0_2 = _mm_loadu_si128((__m128i *)(s + 7 * pitch));

  highbd_transpose8x8_sse2(&p6_2, &p5_2, &p4_2, &p3_2, &p2_2, &p1_2, &p0_2,
                           &q0_2, &q[0], &q[1], &q[2], &q[3], &q[4], &q[5],
                           &q[6], &d7);

  highbd_lpf_internal_14_dual_sse2(p, q, blimit0, limit0, thresh0, blimit1,
                                   limit1, thresh1, bd);

  highbd_transpose8x8_sse2(&d0, &p[6], &p[5], &p[4], &p[3], &p[2], &p[1], &p[0],
                           &d0_out, &d1_out, &d2_out, &d3_out, &d4_out, &d5_out,
                           &d6_out, &d7_out);

  _mm_storeu_si128((__m128i *)(s - 8 + 0 * pitch), d0_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 1 * pitch), d1_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 2 * pitch), d2_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 3 * pitch), d3_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 4 * pitch), d4_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 5 * pitch), d5_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 6 * pitch), d6_out);
  _mm_storeu_si128((__m128i *)(s - 8 + 7 * pitch), d7_out);

  highbd_transpose8x8_sse2(&q[0], &q[1], &q[2], &q[3], &q[4], &q[5], &q[6], &d7,
                           &d0_out, &d1_out, &d2_out, &d3_out, &d4_out, &d5_out,
                           &d6_out, &d7_out);

  _mm_storeu_si128((__m128i *)(s + 0 * pitch), d0_out);
  _mm_storeu_si128((__m128i *)(s + 1 * pitch), d1_out);
  _mm_storeu_si128((__m128i *)(s + 2 * pitch), d2_out);
  _mm_storeu_si128((__m128i *)(s + 3 * pitch), d3_out);
  _mm_storeu_si128((__m128i *)(s + 4 * pitch), d4_out);
  _mm_storeu_si128((__m128i *)(s + 5 * pitch), d5_out);
  _mm_storeu_si128((__m128i *)(s + 6 * pitch), d6_out);
  _mm_storeu_si128((__m128i *)(s + 7 * pitch), d7_out);
}